

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

bool embree::avx512::InstanceArrayIntersector1MB::pointQuery
               (PointQuery *query,PointQueryContext *context,Primitive *prim)

{
  Geometry *pGVar1;
  long *plVar2;
  RTCPointQueryContext *pRVar3;
  undefined8 uVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 uVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  Ref<embree::Geometry> *pRVar23;
  uint uVar24;
  long lVar25;
  _func_int *p_Var26;
  uint uVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  vfloat4 a0_2;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 in_ZMM0 [64];
  float fVar114;
  int iVar115;
  vfloat4 a0;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 in_ZMM1 [64];
  float fVar135;
  vfloat4 a0_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 in_ZMM2 [64];
  undefined4 uVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 in_ZMM4 [64];
  float fVar172;
  vfloat4 b0;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar193;
  undefined4 uVar194;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 in_ZMM7 [64];
  vfloat4 a1;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined8 local_d8;
  undefined4 local_d0;
  float local_cc;
  float local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  _func_int *local_98;
  undefined8 local_90;
  PointQuery *local_88;
  undefined4 local_80;
  undefined1 local_78 [16];
  float local_68;
  void *local_60;
  undefined8 local_58;
  undefined1 local_48 [16];
  
  auVar34 = in_ZMM6._0_16_;
  auVar45 = in_ZMM7._0_16_;
  auVar46 = in_ZMM17._0_16_;
  auVar32 = in_ZMM21._0_16_;
  auVar31 = in_ZMM20._0_16_;
  auVar30 = in_ZMM19._0_16_;
  auVar29 = in_ZMM18._0_16_;
  aVar40 = in_ZMM4._0_16_;
  a0.field_0 = in_ZMM1._0_16_;
  auVar33 = in_ZMM3._0_16_;
  a0_2.field_0 = in_ZMM0._0_16_;
  auVar44 = in_ZMM16._0_16_;
  auVar39 = in_ZMM15._0_16_;
  auVar35 = in_ZMM14._0_16_;
  a0_1.field_0 = in_ZMM2._0_16_;
  uVar18 = (ulong)prim->primID_;
  pRVar23 = (context->scene->geometries).items;
  pGVar1 = pRVar23[prim->instID_].ptr;
  p_Var26 = *(_func_int **)&pGVar1->field_0x58;
  if ((p_Var26 == (_func_int *)0x0) &&
     ((pRVar23 = (Ref<embree::Geometry> *)
                 (ulong)*(uint *)(*(long *)&pGVar1[1].time_range.upper +
                                 (long)pGVar1[1].intersectionFilterN * uVar18),
      pRVar23 == (Ref<embree::Geometry> *)0xffffffff ||
      (p_Var26 = pGVar1[1].super_RefCount._vptr_RefCount[(long)pRVar23], p_Var26 == (_func_int *)0x0
      )))) {
    return false;
  }
  if (pGVar1->numTimeSteps == 1) {
    plVar2 = *(long **)&pGVar1[1].fnumTimeSegments;
    iVar115 = (int)plVar2[4];
    if ((pGVar1->field_8).field_0x1 == '\x01') {
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar19 = *plVar2;
          lVar22 = plVar2[2] * uVar18;
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x10 + lVar22)),0x1c);
          a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar19 + 0x20 + lVar22)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 4 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x14 + lVar22)),0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar19 + 0x24 + lVar22)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 8 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)),0x1c);
          auVar33 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar19 + 0x28 + lVar22)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x1c + lVar22)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar19 + 0x2c + lVar22)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar19 = *plVar2;
          lVar22 = plVar2[2] * uVar18;
          auVar122._8_8_ = 0;
          auVar122._0_8_ = *(ulong *)(lVar19 + 4 + lVar22);
          auVar156._8_8_ = 0;
          auVar156._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar22);
          a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + lVar22)),
                                            (undefined1  [16])_DAT_01fefe80,auVar122);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                            (undefined1  [16])_DAT_01fefe80,auVar156);
          auVar123._8_8_ = 0;
          auVar123._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar22);
          auVar33 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)),
                                       (undefined1  [16])_DAT_01fefe80,auVar123);
          auVar183._8_8_ = 0;
          auVar183._0_8_ = *(ulong *)(lVar19 + 0x28 + lVar22);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0x24 + lVar22)),
                                          (undefined1  [16])_DAT_01fefe80,auVar183);
        }
      }
      else if (iVar115 == 0xb001) {
        lVar19 = *plVar2;
        lVar22 = plVar2[2] * uVar18;
        auVar100._8_8_ = 0;
        auVar100._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar22);
        auVar30 = vinsertps_avx(auVar100,ZEXT416(*(uint *)(lVar19 + 8 + lVar22)),0x20);
        auVar101._8_8_ = 0;
        auVar101._0_8_ = *(ulong *)(lVar19 + 0x34 + lVar22);
        auVar32 = vpermt2ps_avx512vl(auVar101,_DAT_01fefe90,ZEXT416(*(uint *)(lVar19 + lVar22)));
        auVar185._8_8_ = 0;
        auVar185._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar22);
        fVar114 = *(float *)(lVar19 + 0x24 + lVar22);
        fVar75 = *(float *)(lVar19 + 0x28 + lVar22);
        fVar28 = *(float *)(lVar19 + 0x2c + lVar22);
        auVar33 = vpermt2ps_avx512vl(auVar185,_DAT_01fefe90,
                                     ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)));
        fVar135 = *(float *)(lVar19 + 0x30 + lVar22);
        auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar75 * fVar75)),ZEXT416((uint)fVar114),
                                  ZEXT416((uint)fVar114));
        auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
        auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)fVar135),ZEXT416((uint)fVar135));
        auVar45 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar31._0_4_));
        fVar172 = auVar45._0_4_;
        fVar172 = fVar172 * 1.5 + fVar172 * fVar172 * fVar172 * auVar31._0_4_ * -0.5;
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar33,ZEXT416((uint)(fVar172 * fVar114)),0x30);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar32,ZEXT416((uint)(fVar172 * fVar75)),0x30);
        auVar33 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar172 * fVar135)),0x30);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                ZEXT416(*(uint *)(lVar19 + 4 + lVar22)),0x10);
        auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar19 + 0x3c + lVar22)),0x20);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar30,ZEXT416((uint)(fVar28 * fVar172)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar19 = *plVar2;
        lVar22 = plVar2[2] * uVar18;
        a0_2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + lVar22))->v;
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + 0x10 + lVar22))
                        ->v;
        auVar33 = *(undefined1 (*) [16])(lVar19 + 0x20 + lVar22);
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + 0x30 + lVar22))->v
        ;
      }
      auVar30 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar31 = vshufps_avx((undefined1  [16])a0_2.field_0,(undefined1  [16])a0_2.field_0,0xff);
      auVar32 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
      auVar45 = vshufps_avx(auVar33,auVar33,0xff);
      auVar44 = vxorps_avx512vl(auVar29,auVar29);
      auVar29 = vshufps_avx512vl((undefined1  [16])a0_2.field_0,auVar44,0xe9);
      auVar29 = vblendps_avx(auVar29,(undefined1  [16])a0_1.field_0,4);
      fVar193 = auVar31._0_4_;
      auVar34 = vfmadd213ss_fma(auVar30,auVar30,ZEXT416((uint)(fVar193 * fVar193)));
      auVar34 = vfnmadd231ss_fma(auVar34,auVar32,auVar32);
      auVar35 = vfnmadd231ss_fma(auVar34,auVar45,auVar45);
      fVar172 = auVar30._0_4_;
      auVar39 = ZEXT416((uint)(auVar45._0_4_ * fVar172));
      auVar34 = vfmadd213ss_fma(auVar32,auVar31,auVar39);
      fVar114 = auVar34._0_4_ + auVar34._0_4_;
      auVar36 = ZEXT416((uint)(auVar32._0_4_ * fVar172));
      auVar34 = vfmsub213ss_fma(auVar45,auVar31,auVar36);
      fVar75 = auVar34._0_4_ + auVar34._0_4_;
      auVar34 = vfmsub231ss_fma(auVar39,auVar31,auVar32);
      fVar28 = auVar34._0_4_ + auVar34._0_4_;
      auVar34 = vfmsub231ss_fma(ZEXT416((uint)(fVar193 * fVar193)),auVar30,auVar30);
      auVar30 = vfmadd213ss_fma(auVar32,auVar32,auVar34);
      auVar39 = vfnmadd231ss_fma(auVar30,auVar45,auVar45);
      auVar30 = vfmadd213ss_avx512f(auVar45,auVar32,ZEXT416((uint)(fVar193 * fVar172)));
      auVar46 = vaddss_avx512f(auVar30,auVar30);
      auVar30 = vfmadd213ss_fma(auVar31,auVar45,auVar36);
      fVar135 = auVar30._0_4_ + auVar30._0_4_;
      auVar30 = vfmsub231ss_fma(ZEXT416((uint)(fVar193 * fVar172)),auVar32,auVar45);
      fVar172 = auVar30._0_4_ + auVar30._0_4_;
      auVar30 = vfnmadd231ss_fma(auVar34,auVar32,auVar32);
      auVar31 = vfmadd231ss_fma(auVar30,auVar45,auVar45);
      uVar150 = auVar35._0_4_;
      auVar204._4_4_ = uVar150;
      auVar204._0_4_ = uVar150;
      auVar204._8_4_ = uVar150;
      auVar204._12_4_ = uVar150;
      auVar211._4_4_ = fVar114;
      auVar211._0_4_ = fVar114;
      auVar211._8_4_ = fVar114;
      auVar211._12_4_ = fVar114;
      auVar225._0_4_ = fVar75 * 0.0;
      auVar225._4_4_ = fVar75 * 0.0;
      auVar225._8_4_ = fVar75 * 1.0;
      auVar225._12_4_ = fVar75 * 0.0;
      auVar32 = ZEXT816(0x3f80000000000000);
      auVar30 = vfmadd231ps_fma(auVar225,auVar32,auVar211);
      auVar35 = SUB6416(ZEXT464(0x3f800000),0);
      auVar45 = vfmadd231ps_fma(auVar30,auVar35,auVar204);
      auVar205._4_4_ = fVar28;
      auVar205._0_4_ = fVar28;
      auVar205._8_4_ = fVar28;
      auVar205._12_4_ = fVar28;
      uVar150 = auVar39._0_4_;
      auVar212._4_4_ = uVar150;
      auVar212._0_4_ = uVar150;
      auVar212._8_4_ = uVar150;
      auVar212._12_4_ = uVar150;
      auVar30 = vbroadcastss_avx512vl(auVar46);
      auVar223._0_4_ = auVar30._0_4_ * 0.0;
      auVar223._4_4_ = auVar30._4_4_ * 0.0;
      auVar223._8_4_ = auVar30._8_4_ * 1.0;
      auVar223._12_4_ = auVar30._12_4_ * 0.0;
      auVar30 = vfmadd231ps_fma(auVar223,auVar32,auVar212);
      auVar34 = vfmadd231ps_fma(auVar30,auVar35,auVar205);
      auVar199._4_4_ = fVar135;
      auVar199._0_4_ = fVar135;
      auVar199._8_4_ = fVar135;
      auVar199._12_4_ = fVar135;
      auVar186._4_4_ = fVar172;
      auVar186._0_4_ = fVar172;
      auVar186._8_4_ = fVar172;
      auVar186._12_4_ = fVar172;
      fVar114 = auVar31._0_4_;
      auVar206._0_4_ = fVar114 * 0.0;
      auVar206._4_4_ = fVar114 * 0.0;
      auVar206._8_4_ = fVar114 * 1.0;
      auVar206._12_4_ = fVar114 * 0.0;
      auVar30 = vfmadd231ps_fma(auVar206,auVar32,auVar186);
      auVar35 = vfmadd231ps_fma(auVar30,auVar35,auVar199);
      aVar40 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vaddps_avx512vl(auVar29,auVar44);
      auVar102._0_4_ = a0_2.field_0._0_4_;
      auVar102._4_4_ = auVar102._0_4_;
      auVar102._8_4_ = auVar102._0_4_;
      auVar102._12_4_ = auVar102._0_4_;
      auVar30 = vmulps_avx512vl(auVar35,auVar44);
      auVar29 = vfmadd213ps_avx512vl(auVar44,auVar34,auVar30);
      auVar29 = vfmadd231ps_avx512vl(auVar29,auVar45,auVar102);
      iVar115 = a0_1.field_0._0_4_;
      auVar103._4_4_ = iVar115;
      auVar103._0_4_ = iVar115;
      auVar103._8_4_ = iVar115;
      auVar103._12_4_ = iVar115;
      auVar31 = vshufps_avx512vl((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55)
      ;
      auVar30 = vfmadd213ps_avx512vl(auVar31,auVar34,auVar30);
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar45,auVar103);
      uVar150 = auVar33._0_4_;
      auVar104._4_4_ = uVar150;
      auVar104._0_4_ = uVar150;
      auVar104._8_4_ = uVar150;
      auVar104._12_4_ = uVar150;
      auVar31 = vshufps_avx(auVar33,auVar33,0x55);
      auVar33 = vshufps_avx(auVar33,auVar33,0xaa);
      auVar32 = vmulps_avx512vl(auVar33,auVar35);
      auVar31 = vfmadd231ps_avx512vl(auVar32,auVar34,auVar31);
      auVar31 = vfmadd231ps_avx512vl(auVar31,auVar45,auVar104);
      iVar115 = a0.field_0._0_4_;
      a0_2.field_0.i[1] = iVar115;
      a0_2.field_0.i[0] = iVar115;
      a0_2.field_0.i[2] = iVar115;
      a0_2.field_0.i[3] = iVar115;
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0x55);
      auVar32 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xaa);
      auVar126._0_4_ = auVar32._0_4_ * auVar35._0_4_;
      auVar126._4_4_ = auVar32._4_4_ * auVar35._4_4_;
      auVar126._8_4_ = auVar32._8_4_ * auVar35._8_4_;
      auVar126._12_4_ = auVar32._12_4_ * auVar35._12_4_;
      auVar32 = vfmadd231ps_fma(auVar126,auVar34,(undefined1  [16])a0_1.field_0);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ps_fma(auVar32,auVar45,(undefined1  [16])a0_2.field_0);
      auVar32 = vaddps_avx512vl((undefined1  [16])aVar40,(undefined1  [16])a0.field_0);
    }
    else if (iVar115 < 0x9244) {
      if (iVar115 == 0x9134) {
        lVar19 = *plVar2;
        lVar22 = plVar2[2] * uVar18;
        uVar24 = *(uint *)(lVar19 + 4 + lVar22);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar24);
        uVar21 = *(uint *)(lVar19 + 8 + lVar22);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar21);
        uVar27 = *(uint *)(lVar19 + 0xc + lVar22);
        auVar33 = ZEXT416(uVar27);
        auVar29 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + lVar22)),
                                ZEXT416(*(uint *)(lVar19 + 0x10 + lVar22)),0x1c);
        auVar29 = vinsertps_avx512f(auVar29,ZEXT416(*(uint *)(lVar19 + 0x20 + lVar22)),0x28);
        auVar30 = vinsertps_avx(ZEXT416(uVar24),ZEXT416(*(uint *)(lVar19 + 0x14 + lVar22)),0x1c);
        auVar30 = vinsertps_avx512f(auVar30,ZEXT416(*(uint *)(lVar19 + 0x24 + lVar22)),0x28);
        auVar31 = vinsertps_avx(ZEXT416(uVar21),ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)),0x1c);
        auVar31 = vinsertps_avx512f(auVar31,ZEXT416(*(uint *)(lVar19 + 0x28 + lVar22)),0x28);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(ZEXT416(uVar27),ZEXT416(*(uint *)(lVar19 + 0x1c + lVar22)),0x1c
                                    );
        auVar32 = vinsertps_avx512f((undefined1  [16])a0_2.field_0,
                                    ZEXT416(*(uint *)(lVar19 + 0x2c + lVar22)),0x28);
      }
      else if (iVar115 == 0x9234) {
        lVar19 = *plVar2;
        lVar22 = plVar2[2] * uVar18;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = *(ulong *)(lVar19 + 4 + lVar22);
        a0_1.field_0._8_8_ = 0;
        a0_1.field_0._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar22);
        auVar29 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + lVar22)),
                                     (undefined1  [16])_DAT_01fefe80,auVar76);
        auVar30 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                     (undefined1  [16])_DAT_01fefe80,(undefined1  [16])a0_1.field_0)
        ;
        auVar77._8_8_ = 0;
        auVar77._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar22);
        auVar31 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)),
                                     (undefined1  [16])_DAT_01fefe80,auVar77);
        a0_2.field_0._8_8_ = 0;
        a0_2.field_0._0_8_ = *(ulong *)(lVar19 + 0x28 + lVar22);
        auVar32 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0x24 + lVar22)),
                                     (undefined1  [16])_DAT_01fefe80,(undefined1  [16])a0_2.field_0)
        ;
        a0.field_0 = _DAT_01fefe80;
      }
    }
    else if (iVar115 == 0xb001) {
      lVar19 = *plVar2;
      lVar22 = plVar2[2] * uVar18;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar22);
      auVar30 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(lVar19 + 8 + lVar22)),0x20);
      auVar116._8_8_ = 0;
      auVar116._0_8_ = *(ulong *)(lVar19 + 0x34 + lVar22);
      uVar24 = *(uint *)(lVar19 + 0xc + lVar22);
      aVar40 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar24);
      auVar31 = vpermt2ps_avx512vl(auVar116,_DAT_01fefe90,ZEXT416(*(uint *)(lVar19 + lVar22)));
      auVar173._8_8_ = 0;
      auVar173._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar22);
      fVar114 = *(float *)(lVar19 + 0x24 + lVar22);
      fVar75 = *(float *)(lVar19 + 0x28 + lVar22);
      fVar28 = *(float *)(lVar19 + 0x2c + lVar22);
      auVar32 = vpermt2ps_avx512vl(auVar173,_DAT_01fefe90,ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22))
                                  );
      fVar135 = *(float *)(lVar19 + 0x30 + lVar22);
      auVar29 = vfmadd231ss_fma(ZEXT416((uint)(fVar75 * fVar75)),ZEXT416((uint)fVar114),
                                ZEXT416((uint)fVar114));
      auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
      auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)fVar135),ZEXT416((uint)fVar135));
      auVar33 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar29._0_4_));
      fVar172 = auVar33._0_4_;
      fVar172 = fVar172 * 1.5 + fVar172 * fVar172 * fVar172 * auVar29._0_4_ * -0.5;
      auVar33 = ZEXT416((uint)fVar172);
      auVar32 = vinsertps_avx512f(auVar32,ZEXT416((uint)(fVar114 * fVar172)),0x30);
      auVar29 = vinsertps_avx512f(auVar31,ZEXT416((uint)(fVar75 * fVar172)),0x30);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar28 * fVar172));
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     ZEXT416((uint)(fVar135 * fVar172));
      auVar31 = vinsertps_avx512f(auVar30,ZEXT416((uint)(fVar135 * fVar172)),0x30);
      auVar30 = vinsertps_avx(ZEXT416(uVar24),ZEXT416(*(uint *)(lVar19 + 4 + lVar22)),0x10);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar19 + 0x3c + lVar22)),0x20);
      auVar30 = vinsertps_avx512f((undefined1  [16])a0_2.field_0,ZEXT416((uint)(fVar28 * fVar172)),
                                  0x30);
    }
    else if (iVar115 == 0x9244) {
      lVar19 = *plVar2;
      lVar22 = plVar2[2] * uVar18;
      auVar29 = *(undefined1 (*) [16])(lVar19 + lVar22);
      auVar30 = *(undefined1 (*) [16])(lVar19 + 0x10 + lVar22);
      auVar31 = *(undefined1 (*) [16])(lVar19 + 0x20 + lVar22);
      auVar32 = *(undefined1 (*) [16])(lVar19 + 0x30 + lVar22);
    }
LAB_01f71e6b:
    plVar2 = *(long **)&pGVar1[1].fnumTimeSegments;
    iVar115 = (int)plVar2[4];
    if ((pGVar1->field_8).field_0x1 == '\x01') {
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar19 = *plVar2;
          lVar22 = uVar18 * plVar2[2];
          auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x10 + lVar22)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar19 + 0x20 + lVar22)),0x28);
          auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 4 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x14 + lVar22)),0x1c);
          aVar40 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar19 + 0x24 + lVar22)),0x28);
          auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 8 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)),0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar19 + 0x28 + lVar22)),0x28);
          auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x1c + lVar22)),0x1c);
          auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar19 + 0x2c + lVar22)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar19 = *plVar2;
          lVar22 = uVar18 * plVar2[2];
          auVar93._8_8_ = 0;
          auVar93._0_8_ = *(ulong *)(lVar19 + 4 + lVar22);
          auVar140._8_8_ = 0;
          auVar140._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar22);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + lVar22)),
                                          (undefined1  [16])_DAT_01fefe80,auVar93);
          aVar40.v = (__m128)vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                                _DAT_01fefe80,auVar140);
          auVar94._8_8_ = 0;
          auVar94._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar22);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)),
                                            (undefined1  [16])_DAT_01fefe80,auVar94);
          auVar95._8_8_ = 0;
          auVar95._0_8_ = *(ulong *)(lVar19 + 0x28 + lVar22);
          auVar33 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0x24 + lVar22)),
                                       (undefined1  [16])_DAT_01fefe80,auVar95);
        }
      }
      else if (iVar115 == 0xb001) {
        lVar19 = *plVar2;
        lVar22 = uVar18 * plVar2[2];
        auVar99._8_8_ = 0;
        auVar99._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar22);
        auVar45 = vinsertps_avx(auVar99,ZEXT416(*(uint *)(lVar19 + 8 + lVar22)),0x20);
        auVar124._8_8_ = 0;
        auVar124._0_8_ = *(ulong *)(lVar19 + 0x34 + lVar22);
        auVar34 = vpermt2ps_avx512vl(auVar124,_DAT_01fefe90,ZEXT416(*(uint *)(lVar19 + lVar22)));
        auVar184._8_8_ = 0;
        auVar184._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar22);
        fVar114 = *(float *)(lVar19 + 0x24 + lVar22);
        fVar75 = *(float *)(lVar19 + 0x28 + lVar22);
        fVar28 = *(float *)(lVar19 + 0x2c + lVar22);
        auVar35 = vpermt2ps_avx512vl(auVar184,_DAT_01fefe90,
                                     ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)));
        fVar135 = *(float *)(lVar19 + 0x30 + lVar22);
        auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar75 * fVar75)),ZEXT416((uint)fVar114),
                                  ZEXT416((uint)fVar114));
        auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
        auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar135),ZEXT416((uint)fVar135));
        auVar39 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar33._0_4_));
        fVar172 = auVar39._0_4_;
        fVar172 = fVar172 * 1.5 + fVar172 * fVar172 * fVar172 * auVar33._0_4_ * -0.5;
        auVar33 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar172 * fVar114)),0x30);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar34,ZEXT416((uint)(fVar172 * fVar75)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar45,ZEXT416((uint)(fVar172 * fVar135)),0x30);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                ZEXT416(*(uint *)(lVar19 + 4 + lVar22)),0x10);
        auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar19 + 0x3c + lVar22)),0x20);
        aVar40 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vinsertps_avx(auVar45,ZEXT416((uint)(fVar28 * fVar172)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar19 = *plVar2;
        lVar22 = uVar18 * plVar2[2];
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + lVar22))->v;
        aVar40 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                  ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + 0x10 + lVar22))->v;
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + 0x20 + lVar22))
                        ->v;
        auVar33 = *(undefined1 (*) [16])(lVar19 + 0x30 + lVar22);
      }
      auVar34 = vshufps_avx(auVar33,auVar33,0xff);
      auVar35 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar39 = vshufps_avx((undefined1  [16])aVar40,(undefined1  [16])aVar40,0xff);
      auVar44 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
      auVar45 = vshufps_avx((undefined1  [16])a0.field_0,ZEXT816(0) << 0x40,0xe9);
      auVar45 = vblendps_avx(auVar45,(undefined1  [16])aVar40,4);
      fVar193 = auVar35._0_4_;
      auVar46 = vfmadd213ss_fma(auVar34,auVar34,ZEXT416((uint)(fVar193 * fVar193)));
      auVar46 = vfnmadd231ss_fma(auVar46,auVar39,auVar39);
      auVar36 = vfnmadd231ss_fma(auVar46,auVar44,auVar44);
      fVar172 = auVar34._0_4_;
      auVar42 = ZEXT416((uint)(auVar44._0_4_ * fVar172));
      auVar46 = vfmadd213ss_fma(auVar39,auVar35,auVar42);
      fVar114 = auVar46._0_4_ + auVar46._0_4_;
      auVar41 = ZEXT416((uint)(auVar39._0_4_ * fVar172));
      auVar46 = vfmsub213ss_fma(auVar44,auVar35,auVar41);
      fVar75 = auVar46._0_4_ + auVar46._0_4_;
      auVar46 = vfmsub231ss_fma(auVar42,auVar35,auVar39);
      fVar28 = auVar46._0_4_ + auVar46._0_4_;
      auVar46 = vfmsub231ss_fma(ZEXT416((uint)(fVar193 * fVar193)),auVar34,auVar34);
      auVar34 = vfmadd213ss_avx512f(auVar39,auVar39,auVar46);
      auVar42 = vfnmadd231ss_avx512f(auVar34,auVar44,auVar44);
      auVar34 = vfmadd213ss_avx512f(auVar44,auVar39,ZEXT416((uint)(fVar172 * fVar193)));
      auVar43 = vaddss_avx512f(auVar34,auVar34);
      auVar34 = vfmadd213ss_fma(auVar35,auVar44,auVar41);
      fVar135 = auVar34._0_4_ + auVar34._0_4_;
      auVar34 = vfmsub231ss_fma(ZEXT416((uint)(fVar172 * fVar193)),auVar39,auVar44);
      fVar172 = auVar34._0_4_ + auVar34._0_4_;
      auVar34 = vfnmadd231ss_fma(auVar46,auVar39,auVar39);
      auVar35 = vfmadd231ss_fma(auVar34,auVar44,auVar44);
      uVar150 = auVar36._0_4_;
      auVar208._4_4_ = uVar150;
      auVar208._0_4_ = uVar150;
      auVar208._8_4_ = uVar150;
      auVar208._12_4_ = uVar150;
      auVar217._4_4_ = fVar114;
      auVar217._0_4_ = fVar114;
      auVar217._8_4_ = fVar114;
      auVar217._12_4_ = fVar114;
      auVar226._0_4_ = fVar75 * 0.0;
      auVar226._4_4_ = fVar75 * 0.0;
      auVar226._8_4_ = fVar75 * 1.0;
      auVar226._12_4_ = fVar75 * 0.0;
      auVar46 = ZEXT816(0x3f80000000000000);
      auVar34 = vfmadd231ps_fma(auVar226,auVar46,auVar217);
      auVar36 = SUB6416(ZEXT464(0x3f800000),0);
      auVar39 = vfmadd231ps_fma(auVar34,auVar36,auVar208);
      auVar209._4_4_ = fVar28;
      auVar209._0_4_ = fVar28;
      auVar209._8_4_ = fVar28;
      auVar209._12_4_ = fVar28;
      auVar34 = vbroadcastss_avx512vl(auVar42);
      auVar44 = vbroadcastss_avx512vl(auVar43);
      auVar224._0_4_ = auVar44._0_4_ * 0.0;
      auVar224._4_4_ = auVar44._4_4_ * 0.0;
      auVar224._8_4_ = auVar44._8_4_ * 1.0;
      auVar224._12_4_ = auVar44._12_4_ * 0.0;
      auVar34 = vfmadd231ps_fma(auVar224,auVar46,auVar34);
      auVar44 = vfmadd231ps_fma(auVar34,auVar36,auVar209);
      auVar202._4_4_ = fVar135;
      auVar202._0_4_ = fVar135;
      auVar202._8_4_ = fVar135;
      auVar202._12_4_ = fVar135;
      auVar197._4_4_ = fVar172;
      auVar197._0_4_ = fVar172;
      auVar197._8_4_ = fVar172;
      auVar197._12_4_ = fVar172;
      fVar114 = auVar35._0_4_;
      auVar210._0_4_ = fVar114 * 0.0;
      auVar210._4_4_ = fVar114 * 0.0;
      auVar210._8_4_ = fVar114 * 1.0;
      auVar210._12_4_ = fVar114 * 0.0;
      auVar34 = vfmadd231ps_fma(auVar210,auVar46,auVar197);
      auVar34 = vfmadd231ps_fma(auVar34,auVar36,auVar202);
      auVar125._0_4_ = a0.field_0._0_4_;
      auVar125._4_4_ = auVar125._0_4_;
      auVar125._8_4_ = auVar125._0_4_;
      auVar125._12_4_ = auVar125._0_4_;
      fVar114 = auVar34._0_4_;
      auVar198._0_4_ = fVar114 * 0.0;
      fVar75 = auVar34._4_4_;
      auVar198._4_4_ = fVar75 * 0.0;
      fVar28 = auVar34._8_4_;
      auVar198._8_4_ = fVar28 * 0.0;
      fVar135 = auVar34._12_4_;
      auVar198._12_4_ = fVar135 * 0.0;
      auVar34 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar44,auVar198);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar34,auVar39,auVar125);
      iVar115 = aVar40.i[0];
      auVar203._4_4_ = iVar115;
      auVar203._0_4_ = iVar115;
      auVar203._8_4_ = iVar115;
      auVar203._12_4_ = iVar115;
      auVar34 = vshufps_avx((undefined1  [16])aVar40,(undefined1  [16])aVar40,0x55);
      auVar34 = vfmadd213ps_fma(auVar34,auVar44,auVar198);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ps_fma(auVar34,auVar39,auVar203);
      iVar115 = a0_1.field_0._0_4_;
      auVar169._4_4_ = iVar115;
      auVar169._0_4_ = iVar115;
      auVar169._8_4_ = iVar115;
      auVar169._12_4_ = iVar115;
      auVar34 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
      auVar35 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
      auVar142._0_4_ = fVar114 * auVar35._0_4_;
      auVar142._4_4_ = fVar75 * auVar35._4_4_;
      auVar142._8_4_ = fVar28 * auVar35._8_4_;
      auVar142._12_4_ = fVar135 * auVar35._12_4_;
      auVar34 = vfmadd231ps_fma(auVar142,auVar44,auVar34);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar34,auVar39,auVar169);
      uVar150 = auVar33._0_4_;
      auVar170._4_4_ = uVar150;
      auVar170._0_4_ = uVar150;
      auVar170._8_4_ = uVar150;
      auVar170._12_4_ = uVar150;
      auVar34 = vshufps_avx(auVar33,auVar33,0x55);
      auVar33 = vshufps_avx(auVar33,auVar33,0xaa);
      auVar157._0_4_ = fVar114 * auVar33._0_4_;
      auVar157._4_4_ = fVar75 * auVar33._4_4_;
      auVar157._8_4_ = fVar28 * auVar33._8_4_;
      auVar157._12_4_ = fVar135 * auVar33._12_4_;
      auVar33 = vfmadd231ps_fma(auVar157,auVar44,auVar34);
      auVar34 = vfmadd231ps_fma(auVar33,auVar39,auVar170);
      auVar33._0_4_ = auVar45._0_4_ + 0.0 + auVar34._0_4_;
      auVar33._4_4_ = auVar45._4_4_ + 0.0 + auVar34._4_4_;
      auVar33._8_4_ = auVar45._8_4_ + 0.0 + auVar34._8_4_;
      auVar33._12_4_ = auVar45._12_4_ + 0.0 + auVar34._12_4_;
    }
    else if (iVar115 < 0x9244) {
      if (iVar115 == 0x9134) {
        lVar19 = *plVar2;
        lVar22 = uVar18 * plVar2[2];
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + lVar22)),
                                ZEXT416(*(uint *)(lVar19 + 0x10 + lVar22)),0x1c);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar19 + 0x20 + lVar22)),0x28);
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 4 + lVar22)),
                                ZEXT416(*(uint *)(lVar19 + 0x14 + lVar22)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar19 + 0x24 + lVar22)),0x28);
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 8 + lVar22)),
                                ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar19 + 0x28 + lVar22)),0x28);
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                ZEXT416(*(uint *)(lVar19 + 0x1c + lVar22)),0x1c);
        auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar19 + 0x2c + lVar22)),0x28);
      }
      else if (iVar115 == 0x9234) {
        lVar19 = *plVar2;
        lVar22 = uVar18 * plVar2[2];
        auVar136._8_8_ = 0;
        auVar136._0_8_ = *(ulong *)(lVar19 + 4 + lVar22);
        auVar151._8_8_ = 0;
        auVar151._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar22);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + lVar22)),
                                          (undefined1  [16])_DAT_01fefe80,auVar136);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                        (undefined1  [16])_DAT_01fefe80,auVar151);
        auVar152._8_8_ = 0;
        auVar152._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar22);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)),
                                          (undefined1  [16])_DAT_01fefe80,auVar152);
        auVar174._8_8_ = 0;
        auVar174._0_8_ = *(ulong *)(lVar19 + 0x28 + lVar22);
        auVar33 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0x24 + lVar22)),
                                     (undefined1  [16])_DAT_01fefe80,auVar174);
      }
    }
    else if (iVar115 == 0xb001) {
      lVar19 = *plVar2;
      lVar22 = uVar18 * plVar2[2];
      auVar81._8_8_ = 0;
      auVar81._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar22);
      auVar45 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(lVar19 + 8 + lVar22)),0x20);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = *(ulong *)(lVar19 + 0x34 + lVar22);
      auVar34 = vpermt2ps_avx512vl(auVar82,_DAT_01fefe90,ZEXT416(*(uint *)(lVar19 + lVar22)));
      auVar175._8_8_ = 0;
      auVar175._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar22);
      fVar114 = *(float *)(lVar19 + 0x24 + lVar22);
      fVar75 = *(float *)(lVar19 + 0x28 + lVar22);
      fVar28 = *(float *)(lVar19 + 0x2c + lVar22);
      auVar35 = vpermt2ps_avx512vl(auVar175,_DAT_01fefe90,ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22))
                                  );
      fVar135 = *(float *)(lVar19 + 0x30 + lVar22);
      auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar75 * fVar75)),ZEXT416((uint)fVar114),
                                ZEXT416((uint)fVar114));
      auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
      auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar135),ZEXT416((uint)fVar135));
      auVar39 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar33._0_4_));
      fVar172 = auVar39._0_4_;
      fVar172 = fVar172 * 1.5 + fVar172 * fVar172 * fVar172 * auVar33._0_4_ * -0.5;
      auVar33 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar172 * fVar114)),0x30);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar34,ZEXT416((uint)(fVar172 * fVar75)),0x30);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar45,ZEXT416((uint)(fVar172 * fVar135)),0x30);
      auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                              ZEXT416(*(uint *)(lVar19 + 4 + lVar22)),0x10);
      auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar19 + 0x3c + lVar22)),0x20);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar45,ZEXT416((uint)(fVar28 * fVar172)),0x30);
    }
    else if (iVar115 == 0x9244) {
      lVar19 = *plVar2;
      lVar22 = uVar18 * plVar2[2];
      a0_2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + lVar22))->v;
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + 0x10 + lVar22))->v;
      a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + 0x20 + lVar22))->v
      ;
      auVar33 = *(undefined1 (*) [16])(lVar19 + 0x30 + lVar22);
    }
  }
  else {
    fVar114 = (pGVar1->time_range).lower;
    fVar75 = (pGVar1->time_range).upper;
    auVar33 = ZEXT416((uint)fVar75);
    fVar114 = pGVar1->fnumTimeSegments * ((query->time - fVar114) / (fVar75 - fVar114));
    auVar36 = ZEXT416((uint)fVar114);
    auVar42 = vroundss_avx(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),9);
    auVar43 = vminss_avx(auVar42,ZEXT416((uint)(pGVar1->fnumTimeSegments + -1.0)));
    auVar42 = SUB6416(ZEXT864(0),0) << 0x20;
    aVar37 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxss_avx(ZEXT816(0) << 0x20,auVar43);
    fVar114 = fVar114 - aVar37.v[0];
    auVar41 = ZEXT416((uint)fVar114);
    auVar43 = ZEXT416((uint)fVar114);
    iVar20 = (int)aVar37.v[0];
    lVar19 = *(long *)&pGVar1[1].fnumTimeSegments;
    lVar22 = CONCAT44((int)((ulong)pRVar23 >> 0x20),iVar20) * 0x38;
    plVar2 = (long *)(lVar19 + lVar22);
    iVar115 = *(int *)(lVar19 + 0x20 + lVar22);
    if ((pGVar1->field_8).field_0x1 == '\x01') {
      auVar33 = ZEXT416((uint)fVar114);
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar22 = *plVar2;
          lVar25 = plVar2[2] * uVar18;
          auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + lVar25)),
                                  ZEXT416(*(uint *)(lVar22 + 0x10 + lVar25)),0x1c);
          auVar35 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar22 + 0x20 + lVar25)),0x28);
          auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 4 + lVar25)),
                                  ZEXT416(*(uint *)(lVar22 + 0x14 + lVar25)),0x1c);
          auVar43 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar22 + 0x24 + lVar25)),0x28);
          auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 8 + lVar25)),
                                  ZEXT416(*(uint *)(lVar22 + 0x18 + lVar25)),0x1c);
          auVar44 = vinsertps_avx512f(auVar45,ZEXT416(*(uint *)(lVar22 + 0x28 + lVar25)),0x28);
          auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 0xc + lVar25)),
                                  ZEXT416(*(uint *)(lVar22 + 0x1c + lVar25)),0x1c);
          auVar39 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar22 + 0x2c + lVar25)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar22 = *plVar2;
          lVar25 = plVar2[2] * uVar18;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)(lVar22 + 4 + lVar25);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = *(ulong *)(lVar22 + 0x10 + lVar25);
          auVar35 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + lVar25)),
                                       (undefined1  [16])_DAT_01fefe80,auVar44);
          auVar43 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0xc + lVar25)),
                                       (undefined1  [16])_DAT_01fefe80,auVar43);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = *(ulong *)(lVar22 + 0x1c + lVar25);
          auVar44 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0x18 + lVar25)),
                                       (undefined1  [16])_DAT_01fefe80,auVar41);
          auVar56._8_8_ = 0;
          auVar56._0_8_ = *(ulong *)(lVar22 + 0x28 + lVar25);
          auVar39 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0x24 + lVar25)),
                                       (undefined1  [16])_DAT_01fefe80,auVar56);
        }
      }
      else if (iVar115 == 0xb001) {
        lVar22 = *plVar2;
        lVar25 = plVar2[2] * uVar18;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)(lVar22 + 0x10 + lVar25);
        auVar45 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar22 + 8 + lVar25)),0x20);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)(lVar22 + 0x34 + lVar25);
        auVar35 = vpermt2ps_avx512vl(auVar35,_DAT_01fefe90,ZEXT416(*(uint *)(lVar22 + lVar25)));
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)(lVar22 + 0x1c + lVar25);
        fVar75 = *(float *)(lVar22 + 0x24 + lVar25);
        fVar28 = *(float *)(lVar22 + 0x28 + lVar25);
        fVar135 = *(float *)(lVar22 + 0x2c + lVar25);
        auVar39 = vpermt2ps_avx512vl(auVar39,_DAT_01fefe90,
                                     ZEXT416(*(uint *)(lVar22 + 0x18 + lVar25)));
        fVar172 = *(float *)(lVar22 + 0x30 + lVar25);
        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),ZEXT416((uint)fVar75),
                                  ZEXT416((uint)fVar75));
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar135),ZEXT416((uint)fVar135));
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
        auVar44 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar34._0_4_));
        fVar193 = auVar44._0_4_;
        fVar193 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar34._0_4_ * -0.5;
        auVar39 = vinsertps_avx(auVar39,ZEXT416((uint)(fVar75 * fVar193)),0x30);
        auVar35 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar28 * fVar193)),0x30);
        auVar44 = vinsertps_avx512f(auVar45,ZEXT416((uint)(fVar172 * fVar193)),0x30);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 0xc + lVar25)),
                                ZEXT416(*(uint *)(lVar22 + 4 + lVar25)),0x10);
        auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar22 + 0x3c + lVar25)),0x20);
        auVar43 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar135 * fVar193)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar22 = *plVar2;
        lVar25 = plVar2[2] * uVar18;
        auVar35 = *(undefined1 (*) [16])(lVar22 + lVar25);
        auVar43 = *(undefined1 (*) [16])(lVar22 + 0x10 + lVar25);
        auVar44 = *(undefined1 (*) [16])(lVar22 + 0x20 + lVar25);
        auVar39 = *(undefined1 (*) [16])(lVar22 + 0x30 + lVar25);
      }
      lVar22 = (ulong)(iVar20 + 1) * 0x38;
      plVar2 = (long *)(lVar19 + lVar22);
      iVar115 = *(int *)(lVar19 + 0x20 + lVar22);
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar19 = *plVar2;
          lVar22 = uVar18 * plVar2[2];
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x10 + lVar22)),0x1c);
          auVar46 = vinsertps_avx512f(auVar30,ZEXT416(*(uint *)(lVar19 + 0x20 + lVar22)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 4 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x14 + lVar22)),0x1c);
          auVar30 = vinsertps_avx512f(auVar30,ZEXT416(*(uint *)(lVar19 + 0x24 + lVar22)),0x28);
          auVar31 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 8 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)),0x1c);
          auVar31 = vinsertps_avx512f(auVar31,ZEXT416(*(uint *)(lVar19 + 0x28 + lVar22)),0x28);
          auVar32 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x1c + lVar22)),0x1c);
          auVar32 = vinsertps_avx512f(auVar32,ZEXT416(*(uint *)(lVar19 + 0x2c + lVar22)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar19 = *plVar2;
          lVar22 = uVar18 * plVar2[2];
          auVar53._8_8_ = 0;
          auVar53._0_8_ = *(ulong *)(lVar19 + 4 + lVar22);
          auVar57._8_8_ = 0;
          auVar57._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar22);
          auVar46 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + lVar22)),
                                       (undefined1  [16])_DAT_01fefe80,auVar53);
          auVar30 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                       (undefined1  [16])_DAT_01fefe80,auVar57);
          auVar54._8_8_ = 0;
          auVar54._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar22);
          auVar31 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)),
                                       (undefined1  [16])_DAT_01fefe80,auVar54);
          auVar55._8_8_ = 0;
          auVar55._0_8_ = *(ulong *)(lVar19 + 0x28 + lVar22);
          auVar32 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0x24 + lVar22)),
                                       (undefined1  [16])_DAT_01fefe80,auVar55);
        }
      }
      else if (iVar115 == 0xb001) {
        lVar19 = *plVar2;
        lVar22 = uVar18 * plVar2[2];
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar22);
        auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar19 + 8 + lVar22)),0x20);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)(lVar19 + 0x34 + lVar22);
        auVar45 = vpermt2ps_avx512vl(auVar31,_DAT_01fefe90,ZEXT416(*(uint *)(lVar19 + lVar22)));
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar22);
        fVar75 = *(float *)(lVar19 + 0x24 + lVar22);
        fVar28 = *(float *)(lVar19 + 0x28 + lVar22);
        fVar135 = *(float *)(lVar19 + 0x2c + lVar22);
        auVar32 = vpermt2ps_avx512vl(auVar32,_DAT_01fefe90,
                                     ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)));
        fVar172 = *(float *)(lVar19 + 0x30 + lVar22);
        auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),ZEXT416((uint)fVar75),
                                  ZEXT416((uint)fVar75));
        auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)fVar135),ZEXT416((uint)fVar135));
        auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
        auVar46._4_12_ = ZEXT812(0) << 0x20;
        auVar46._0_4_ = auVar31._0_4_;
        auVar34 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar46);
        fVar193 = auVar34._0_4_;
        fVar193 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar31._0_4_ * -0.5;
        auVar32 = vinsertps_avx512f(auVar32,ZEXT416((uint)(fVar75 * fVar193)),0x30);
        auVar46 = vinsertps_avx512f(auVar45,ZEXT416((uint)(fVar28 * fVar193)),0x30);
        auVar31 = vinsertps_avx512f(auVar30,ZEXT416((uint)(fVar172 * fVar193)),0x30);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                ZEXT416(*(uint *)(lVar19 + 4 + lVar22)),0x10);
        auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar19 + 0x3c + lVar22)),0x20);
        auVar30 = vinsertps_avx512f(auVar30,ZEXT416((uint)(fVar135 * fVar193)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar19 = *plVar2;
        lVar22 = uVar18 * plVar2[2];
        auVar46 = *(undefined1 (*) [16])(lVar19 + lVar22);
        auVar30 = *(undefined1 (*) [16])(lVar19 + 0x10 + lVar22);
        auVar31 = *(undefined1 (*) [16])(lVar19 + 0x20 + lVar22);
        auVar32 = *(undefined1 (*) [16])(lVar19 + 0x30 + lVar22);
      }
      auVar36 = vshufps_avx512vl(auVar39,auVar39,0xff);
      auVar42 = vshufps_avx512vl(auVar35,auVar35,0xff);
      auVar45 = vshufps_avx(auVar43,auVar43,0xff);
      auVar41 = vshufps_avx512vl(auVar44,auVar44,0xff);
      auVar34 = vshufps_avx512vl(auVar32,auVar32,0xff);
      auVar56 = vshufps_avx512vl(auVar46,auVar46,0xff);
      auVar53 = vshufps_avx512vl(auVar30,auVar30,0xff);
      auVar54 = vshufps_avx512vl(auVar31,auVar31,0xff);
      auVar55 = vmulss_avx512f(auVar42,auVar56);
      auVar55 = vfmadd231ss_avx512f(auVar55,auVar34,auVar36);
      auVar55 = vfmadd231ss_avx512f(auVar55,auVar53,auVar45);
      auVar55 = vfmadd231ss_avx512f(auVar55,auVar54,auVar41);
      auVar64 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar57 = vxorps_avx512vl(auVar55,auVar64);
      bVar5 = auVar55._0_4_ < auVar57._0_4_;
      auVar58 = vxorps_avx512vl(auVar34,auVar64);
      auVar59 = vxorps_avx512vl(auVar56,auVar64);
      auVar61 = vxorps_avx512vl(auVar53,auVar64);
      auVar38 = vxorps_avx512vl(auVar54,auVar64);
      auVar62._4_12_ = auVar34._4_12_;
      auVar62._0_4_ = (uint)bVar5 * auVar58._0_4_ + (uint)!bVar5 * auVar34._0_4_;
      auVar63._4_12_ = auVar56._4_12_;
      auVar63._0_4_ = (uint)bVar5 * auVar59._0_4_ + (uint)!bVar5 * auVar56._0_4_;
      auVar59._4_12_ = auVar53._4_12_;
      auVar59._0_4_ = (uint)bVar5 * auVar61._0_4_ + (uint)!bVar5 * auVar53._0_4_;
      auVar61._4_12_ = auVar54._4_12_;
      auVar61._0_4_ = (uint)bVar5 * auVar38._0_4_ + (uint)!bVar5 * auVar54._0_4_;
      auVar58._8_4_ = 0x7fffffff;
      auVar58._0_8_ = 0x7fffffff7fffffff;
      auVar58._12_4_ = 0x7fffffff;
      auVar56 = vandps_avx512vl(auVar55,auVar58);
      auVar34 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbb8d3753),0),auVar56,ZEXT416(0x3c9df1b8));
      auVar34 = vfmadd213ss_fma(auVar34,auVar56,ZEXT416(0xbd37e81c));
      auVar34 = vfmadd213ss_fma(auVar34,auVar56,ZEXT416(0x3db3edac));
      auVar34 = vfmadd213ss_fma(auVar34,auVar56,ZEXT416(0xbe5ba881));
      auVar34 = vfmadd213ss_fma(auVar34,auVar56,ZEXT416(0x3fc90fd1));
      auVar53 = vmaxss_avx512f(auVar57,auVar55);
      auVar54 = vsubss_avx512f(ZEXT416(0x3f800000),auVar56);
      auVar55 = ZEXT816(0) << 0x20;
      if (auVar54._0_4_ < 0.0) {
        fVar75 = sqrtf(auVar54._0_4_);
        auVar55 = ZEXT816(0) << 0x40;
        auVar64 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar53 = ZEXT416(auVar53._0_4_);
      }
      else {
        auVar54 = vsqrtss_avx(auVar54,auVar54);
        fVar75 = auVar54._0_4_;
      }
      auVar34 = vmaxss_avx(auVar55,ZEXT416((uint)(1.5707964 - fVar75 * auVar34._0_4_)));
      auVar54 = vxorps_avx512vl(auVar34,auVar64);
      uVar4 = vcmpss_avx512f(auVar53,auVar55,1);
      bVar5 = (bool)((byte)uVar4 & 1);
      auVar58 = ZEXT416(0x3f800000);
      uVar4 = vcmpss_avx512f(auVar58,auVar56,1);
      bVar7 = (bool)((byte)uVar4 & 1);
      fVar75 = fVar114 * (float)((uint)bVar7 * 0x7fc00000 +
                                (uint)!bVar7 *
                                (int)(1.5707964 -
                                     (float)((uint)bVar5 * auVar54._0_4_ +
                                            (uint)!bVar5 * auVar34._0_4_)));
      auVar34 = ZEXT416((uint)(fVar75 * 0.63661975));
      auVar34 = vroundss_avx(auVar34,auVar34,9);
      auVar56 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3fc90fdb),0),auVar34,ZEXT416((uint)fVar75));
      uVar24 = (int)auVar34._0_4_ & 3;
      uVar21 = uVar24 - 1;
      fVar28 = auVar56._0_4_;
      fVar75 = fVar28 * fVar28;
      auVar56 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb2d70013),0),ZEXT416((uint)fVar75),
                                ZEXT416(0x363938a8));
      auVar54 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb48b634d),0),ZEXT416((uint)fVar75),
                                ZEXT416(0x37cfab9c));
      auVar55 = ZEXT416((uint)fVar75);
      auVar56 = vfmadd213ss_fma(auVar56,auVar55,ZEXT416(0xb9501096));
      auVar54 = vfmadd213ss_fma(auVar54,auVar55,ZEXT416(0xbab60981));
      auVar56 = vfmadd213ss_fma(auVar56,auVar55,ZEXT416(0x3c088898));
      auVar54 = vfmadd213ss_fma(auVar54,auVar55,ZEXT416(0x3d2aaaa4));
      auVar55 = ZEXT416((uint)fVar75);
      auVar56 = vfmadd213ss_fma(auVar56,auVar55,ZEXT416(0xbe2aaaab));
      uVar150 = 0;
      auVar54 = vfmadd213ss_fma(auVar54,auVar55,SUB6416(ZEXT464(0xbf000000),0));
      auVar56 = vfmadd213ss_avx512f(auVar56,auVar55,auVar58);
      auVar54 = vfmadd213ss_avx512f(auVar54,auVar55,auVar58);
      fVar28 = fVar28 * auVar56._0_4_;
      bVar6 = (byte)(int)auVar34._0_4_;
      uVar27 = (uint)(bVar6 & 1) * auVar54._0_4_ + (uint)!(bool)(bVar6 & 1) * (int)fVar28;
      auVar60._4_12_ = auVar54._4_12_;
      auVar60._0_4_ = (uint)(bVar6 & 1) * (int)fVar28 + (uint)!(bool)(bVar6 & 1) * auVar54._0_4_;
      auVar34 = vxorps_avx512vl(auVar60,auVar64);
      auVar47._0_4_ = (uint)(uVar21 < 2) * auVar34._0_4_ + (uint)(uVar21 >= 2) * auVar60._0_4_;
      auVar47._4_12_ = auVar60._4_12_;
      auVar56 = vfmsub213ss_avx512f(auVar36,auVar53,auVar62);
      auVar34 = vfmsub213ss_avx512f(auVar42,auVar53,auVar63);
      auVar54 = vfmsub213ss_avx512f(auVar45,auVar53,auVar59);
      auVar53 = vfmsub213ss_avx512f(auVar41,auVar53,auVar61);
      fVar135 = auVar34._0_4_;
      auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * fVar135)),auVar56,auVar56);
      auVar34 = vfmadd231ss_fma(auVar34,auVar54,auVar54);
      auVar34 = vfmadd231ss_fma(auVar34,auVar53,auVar53);
      auVar55 = vxorps_avx512vl(auVar29,auVar29);
      auVar48._4_12_ = auVar55._4_12_;
      auVar48._0_4_ = auVar34._0_4_;
      auVar29 = vrsqrt14ss_avx512f(auVar55,auVar48);
      fVar75 = auVar29._0_4_;
      fVar75 = fVar75 * 1.5 + fVar75 * fVar75 * fVar75 * auVar34._0_4_ * -0.5;
      auVar29 = vxorps_avx512vl(ZEXT416(uVar27),auVar64);
      fVar28 = (float)((1 < uVar24) * uVar27 + (uint)(1 >= uVar24) * auVar29._0_4_);
      auVar56 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar56._0_4_ * fVar75 * fVar28)),auVar47,auVar36
                                   );
      auVar57 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar135 * fVar75 * fVar28)),auVar47,auVar42);
      auVar29 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar75 * fVar28)),auVar47,auVar45);
      auVar34 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * fVar75 * fVar28)),auVar41,auVar47);
      auVar53 = vsubss_avx512f(auVar58,auVar33);
      auVar54 = vmulss_avx512f(auVar33,auVar62);
      auVar54 = vfmadd231ss_avx512f(auVar54,auVar53,auVar36);
      auVar36 = vmulss_avx512f(auVar33,auVar63);
      auVar36 = vfmadd231ss_avx512f(auVar36,auVar53,auVar42);
      auVar42 = vmulss_avx512f(auVar33,auVar59);
      auVar45 = vfmadd231ss_fma(auVar42,auVar53,auVar45);
      auVar33 = vmulss_avx512f(auVar33,auVar61);
      auVar33 = vfmadd231ss_fma(auVar33,auVar53,auVar41);
      fVar28 = auVar36._0_4_;
      auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),auVar54,auVar54);
      auVar36 = vfmadd231ss_fma(auVar36,auVar45,auVar45);
      auVar36 = vfmadd231ss_fma(auVar36,auVar33,auVar33);
      auVar64._4_12_ = auVar48._4_12_;
      auVar64._0_4_ = auVar36._0_4_;
      auVar42 = vrsqrt14ss_avx512f(auVar55,auVar64);
      fVar75 = auVar42._0_4_;
      fVar75 = fVar75 * 1.5 + fVar75 * fVar75 * fVar75 * auVar36._0_4_ * -0.5;
      vucomiss_avx512f(ZEXT416(0x3f7fdf3b));
      bVar5 = 2 < uVar21;
      auVar49._4_12_ = auVar56._4_12_;
      auVar49._0_4_ =
           (float)((uint)bVar5 * (int)(auVar54._0_4_ * fVar75) + (uint)!bVar5 * auVar56._0_4_);
      auVar50._4_12_ = auVar57._4_12_;
      auVar50._0_4_ = (float)((uint)bVar5 * (int)(fVar28 * fVar75) + (uint)!bVar5 * auVar57._0_4_);
      auVar51._4_12_ = auVar29._4_12_;
      auVar51._0_4_ =
           (float)((uint)bVar5 * (int)(auVar45._0_4_ * fVar75) + (uint)!bVar5 * auVar29._0_4_);
      auVar52._4_12_ = auVar34._4_12_;
      auVar52._0_4_ =
           (float)((uint)bVar5 * (int)(auVar33._0_4_ * fVar75) + (uint)!bVar5 * auVar34._0_4_);
      auVar171._4_4_ = fVar114;
      auVar171._0_4_ = fVar114;
      auVar171._8_4_ = fVar114;
      auVar171._12_4_ = fVar114;
      auVar29 = vmulps_avx512vl(auVar171,auVar46);
      auVar187._0_4_ = auVar53._0_4_;
      auVar187._4_4_ = auVar187._0_4_;
      auVar187._8_4_ = auVar187._0_4_;
      auVar187._12_4_ = auVar187._0_4_;
      auVar33 = vfmadd213ps_fma(auVar35,auVar187,auVar29);
      auVar29 = vmulps_avx512vl(auVar171,auVar30);
      auVar30 = vfmadd213ps_fma(auVar43,auVar187,auVar29);
      auVar29 = vmulps_avx512vl(auVar171,auVar31);
      auVar44 = vfmadd213ps_avx512vl(auVar44,auVar187,auVar29);
      auVar29 = vmulps_avx512vl(auVar171,auVar32);
      auVar32 = vfmadd213ps_fma(auVar39,auVar187,auVar29);
      auVar29 = vshufps_avx512vl(auVar33,auVar55,0xe9);
      auVar29 = vblendps_avx(auVar29,auVar30,4);
      auVar31 = vfmadd213ss_fma(auVar49,auVar49,ZEXT416((uint)(auVar50._0_4_ * auVar50._0_4_)));
      auVar31 = vfnmadd231ss_fma(auVar31,auVar51,auVar51);
      auVar34 = vfnmadd231ss_fma(auVar31,auVar52,auVar52);
      auVar31 = vfmadd213ss_fma(auVar51,auVar50,ZEXT416((uint)(auVar49._0_4_ * auVar52._0_4_)));
      fVar114 = auVar31._0_4_ + auVar31._0_4_;
      auVar31 = vfmsub213ss_fma(auVar52,auVar50,ZEXT416((uint)(auVar49._0_4_ * auVar51._0_4_)));
      fVar75 = auVar31._0_4_ + auVar31._0_4_;
      auVar31 = vfmsub231ss_fma(ZEXT416((uint)(auVar49._0_4_ * auVar52._0_4_)),auVar50,auVar51);
      fVar28 = auVar31._0_4_ + auVar31._0_4_;
      auVar45 = vfmsub231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar50._0_4_)),auVar49,auVar49);
      auVar31 = vfmadd213ss_fma(auVar51,auVar51,auVar45);
      auVar41 = vfnmadd231ss_fma(auVar31,auVar52,auVar52);
      auVar31 = vfmadd213ss_fma(auVar52,auVar51,ZEXT416((uint)(auVar49._0_4_ * auVar50._0_4_)));
      fVar135 = auVar31._0_4_ + auVar31._0_4_;
      auVar31 = vfmadd213ss_fma(auVar50,auVar52,ZEXT416((uint)(auVar49._0_4_ * auVar51._0_4_)));
      fVar172 = auVar31._0_4_ + auVar31._0_4_;
      auVar31 = vfmsub231ss_fma(ZEXT416((uint)(auVar49._0_4_ * auVar50._0_4_)),auVar51,auVar52);
      fVar193 = auVar31._0_4_ + auVar31._0_4_;
      auVar31 = vfnmadd231ss_fma(auVar45,auVar51,auVar51);
      auVar38 = vfmadd231ss_fma(auVar31,auVar52,auVar52);
      uVar194 = auVar34._0_4_;
      auVar105._4_4_ = uVar194;
      auVar105._0_4_ = uVar194;
      auVar105._8_4_ = uVar194;
      auVar105._12_4_ = uVar194;
      auVar127._4_4_ = fVar114;
      auVar127._0_4_ = fVar114;
      auVar127._8_4_ = fVar114;
      auVar127._12_4_ = fVar114;
      auVar36 = ZEXT816(0x3f80000000000000);
      auVar200._0_4_ = fVar75 * 0.0;
      auVar200._4_4_ = fVar75 * 0.0;
      auVar200._8_4_ = fVar75 * 1.0;
      auVar200._12_4_ = fVar75 * 0.0;
      auVar31 = vfmadd231ps_fma(auVar200,auVar36,auVar127);
      auVar39 = SUB6416(ZEXT464(0x3f800000),0);
      auVar34 = vfmadd231ps_fma(auVar31,auVar39,auVar105);
      auVar106._4_4_ = fVar28;
      auVar106._0_4_ = fVar28;
      auVar106._8_4_ = fVar28;
      auVar106._12_4_ = fVar28;
      uVar194 = auVar41._0_4_;
      auVar45._4_4_ = uVar194;
      auVar45._0_4_ = uVar194;
      auVar45._8_4_ = uVar194;
      auVar45._12_4_ = uVar194;
      auVar221._0_4_ = fVar135 * 0.0;
      auVar221._4_4_ = fVar135 * 0.0;
      auVar221._8_4_ = fVar135 * 1.0;
      auVar221._12_4_ = fVar135 * 0.0;
      auVar31 = vfmadd231ps_fma(auVar221,auVar36,auVar45);
      auVar35 = vfmadd231ps_fma(auVar31,auVar39,auVar106);
      auVar107._4_4_ = fVar172;
      auVar107._0_4_ = fVar172;
      auVar107._8_4_ = fVar172;
      auVar107._12_4_ = fVar172;
      auVar143._4_4_ = fVar193;
      auVar143._0_4_ = fVar193;
      auVar143._8_4_ = fVar193;
      auVar143._12_4_ = fVar193;
      fVar114 = auVar38._0_4_;
      auVar158._0_4_ = fVar114 * 0.0;
      auVar158._4_4_ = fVar114 * 0.0;
      auVar158._8_4_ = fVar114 * 1.0;
      auVar158._12_4_ = fVar114 * 0.0;
      auVar31 = vfmadd231ps_fma(auVar158,auVar36,auVar143);
      auVar39 = vfmadd231ps_fma(auVar31,auVar39,auVar107);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vaddps_avx512vl(auVar29,auVar55)
      ;
      uVar194 = auVar33._0_4_;
      auVar128._4_4_ = uVar194;
      auVar128._0_4_ = uVar194;
      auVar128._8_4_ = uVar194;
      auVar128._12_4_ = uVar194;
      auVar31 = vmulps_avx512vl(auVar39,auVar55);
      auVar29 = vfmadd213ps_avx512vl(auVar55,auVar35,auVar31);
      auVar29 = vfmadd231ps_avx512vl(auVar29,auVar34,auVar128);
      uVar194 = auVar30._0_4_;
      auVar129._4_4_ = uVar194;
      auVar129._0_4_ = uVar194;
      auVar129._8_4_ = uVar194;
      auVar129._12_4_ = uVar194;
      auVar30 = vshufps_avx512vl(auVar30,auVar30,0x55);
      auVar30 = vfmadd213ps_avx512vl(auVar30,auVar35,auVar31);
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar34,auVar129);
      auVar31 = vbroadcastss_avx512vl(auVar44);
      auVar33 = vshufps_avx512vl(auVar44,auVar44,0x55);
      auVar36 = vshufps_avx512vl(auVar44,auVar44,0xaa);
      auVar36 = vmulps_avx512vl(auVar36,auVar39);
      auVar33 = vfmadd231ps_avx512vl(auVar36,auVar35,auVar33);
      auVar31 = vfmadd231ps_avx512vl(auVar33,auVar34,auVar31);
      uVar194 = auVar32._0_4_;
      a0.field_0.i[1] = uVar194;
      a0.field_0.i[0] = uVar194;
      a0.field_0.i[2] = uVar194;
      a0.field_0.i[3] = uVar194;
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar32,auVar32,0x55);
      aVar40 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar32,auVar32,0xaa);
      auVar159._0_4_ = aVar40.v[0] * auVar39._0_4_;
      auVar159._4_4_ = aVar40.v[1] * auVar39._4_4_;
      auVar159._8_4_ = aVar40.v[2] * auVar39._8_4_;
      auVar159._12_4_ = aVar40.v[3] * auVar39._12_4_;
      auVar32 = vfmadd231ps_fma(auVar159,auVar35,(undefined1  [16])a0_1.field_0);
      auVar33 = vfmadd231ps_fma(auVar32,auVar34,(undefined1  [16])a0.field_0);
      auVar32 = vaddps_avx512vl((undefined1  [16])a0_2.field_0,auVar33);
      uVar18 = (ulong)prim->primID_;
      if (pGVar1->numTimeSteps == 1) goto LAB_01f71e6b;
    }
    else {
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar22 = *plVar2;
          lVar25 = plVar2[2] * uVar18;
          uVar24 = *(uint *)(lVar22 + 4 + lVar25);
          aVar37 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar24);
          uVar21 = *(uint *)(lVar22 + 8 + lVar25);
          auVar42 = ZEXT416(uVar21);
          uVar27 = *(uint *)(lVar22 + 0xc + lVar25);
          auVar33 = ZEXT416(uVar27);
          auVar29 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + lVar25)),
                                  ZEXT416(*(uint *)(lVar22 + 0x10 + lVar25)),0x1c);
          auVar29 = vinsertps_avx512f(auVar29,ZEXT416(*(uint *)(lVar22 + 0x20 + lVar25)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(uVar24),ZEXT416(*(uint *)(lVar22 + 0x14 + lVar25)),0x1c);
          auVar30 = vinsertps_avx512f(auVar30,ZEXT416(*(uint *)(lVar22 + 0x24 + lVar25)),0x28);
          auVar31 = vinsertps_avx(ZEXT416(uVar21),ZEXT416(*(uint *)(lVar22 + 0x18 + lVar25)),0x1c);
          auVar31 = vinsertps_avx512f(auVar31,ZEXT416(*(uint *)(lVar22 + 0x28 + lVar25)),0x28);
          auVar36 = vinsertps_avx(ZEXT416(uVar27),ZEXT416(*(uint *)(lVar22 + 0x1c + lVar25)),0x1c);
          auVar32 = vinsertps_avx512f(auVar36,ZEXT416(*(uint *)(lVar22 + 0x2c + lVar25)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar22 = *plVar2;
          lVar25 = plVar2[2] * uVar18;
          auVar78._8_8_ = 0;
          auVar78._0_8_ = *(ulong *)(lVar22 + 4 + lVar25);
          auVar42._8_8_ = 0;
          auVar42._0_8_ = *(ulong *)(lVar22 + 0x10 + lVar25);
          auVar29 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + lVar25)),
                                       (undefined1  [16])_DAT_01fefe80,auVar78);
          auVar30 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0xc + lVar25)),
                                       (undefined1  [16])_DAT_01fefe80,auVar42);
          auVar79._8_8_ = 0;
          auVar79._0_8_ = *(ulong *)(lVar22 + 0x1c + lVar25);
          auVar31 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0x18 + lVar25)),
                                       (undefined1  [16])_DAT_01fefe80,auVar79);
          auVar36._8_8_ = 0;
          auVar36._0_8_ = *(ulong *)(lVar22 + 0x28 + lVar25);
          auVar32 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0x24 + lVar25)),
                                       (undefined1  [16])_DAT_01fefe80,auVar36);
          aVar37 = _DAT_01fefe80;
        }
      }
      else if (iVar115 == 0xb001) {
        lVar22 = *plVar2;
        lVar25 = plVar2[2] * uVar18;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(lVar22 + 0x10 + lVar25);
        auVar30 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(lVar22 + 8 + lVar25)),0x20);
        auVar117._8_8_ = 0;
        auVar117._0_8_ = *(ulong *)(lVar22 + 0x34 + lVar25);
        auVar31 = vpermt2ps_avx512vl(auVar117,_DAT_01fefe90,ZEXT416(*(uint *)(lVar22 + lVar25)));
        auVar176._8_8_ = 0;
        auVar176._0_8_ = *(ulong *)(lVar22 + 0x1c + lVar25);
        fVar75 = *(float *)(lVar22 + 0x24 + lVar25);
        fVar28 = *(float *)(lVar22 + 0x28 + lVar25);
        auVar45 = ZEXT416((uint)fVar28);
        fVar135 = *(float *)(lVar22 + 0x2c + lVar25);
        auVar32 = vpermt2ps_avx512vl(auVar176,_DAT_01fefe90,
                                     ZEXT416(*(uint *)(lVar22 + 0x18 + lVar25)));
        fVar172 = *(float *)(lVar22 + 0x30 + lVar25);
        auVar29 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),ZEXT416((uint)fVar75),
                                  ZEXT416((uint)fVar75));
        auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)fVar135),ZEXT416((uint)fVar135));
        auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
        auVar33 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar29._0_4_));
        fVar193 = auVar33._0_4_;
        fVar193 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar29._0_4_ * -0.5;
        auVar33 = ZEXT416((uint)fVar193);
        auVar34 = ZEXT416((uint)(fVar75 * fVar193));
        auVar32 = vinsertps_avx512f(auVar32,ZEXT416((uint)(fVar75 * fVar193)),0x30);
        auVar29 = vinsertps_avx512f(auVar31,ZEXT416((uint)(fVar28 * fVar193)),0x30);
        aVar37 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar135 * fVar193));
        auVar42 = ZEXT416((uint)(fVar172 * fVar193));
        auVar31 = vinsertps_avx512f(auVar30,ZEXT416((uint)(fVar172 * fVar193)),0x30);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 0xc + lVar25)),
                                ZEXT416(*(uint *)(lVar22 + 4 + lVar25)),0x10);
        auVar36 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar22 + 0x3c + lVar25)),0x20);
        auVar30 = vinsertps_avx512f(auVar36,ZEXT416((uint)(fVar135 * fVar193)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar22 = *plVar2;
        lVar25 = plVar2[2] * uVar18;
        auVar29 = *(undefined1 (*) [16])(lVar22 + lVar25);
        auVar30 = *(undefined1 (*) [16])(lVar22 + 0x10 + lVar25);
        auVar31 = *(undefined1 (*) [16])(lVar22 + 0x20 + lVar25);
        auVar32 = *(undefined1 (*) [16])(lVar22 + 0x30 + lVar25);
      }
      lVar22 = (ulong)(iVar20 + 1) * 0x38;
      plVar2 = (long *)(lVar19 + lVar22);
      iVar115 = *(int *)(lVar19 + 0x20 + lVar22);
      lVar19 = 0;
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar19 = *plVar2;
          lVar22 = plVar2[2] * uVar18;
          auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x10 + lVar22)),0x1c);
          auVar36 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar19 + 0x20 + lVar22)),0x28);
          auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 4 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x14 + lVar22)),0x1c);
          auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar19 + 0x24 + lVar22)),0x28);
          auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 8 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)),0x1c);
          auVar42 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar19 + 0x28 + lVar22)),0x28);
          auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x1c + lVar22)),0x1c);
          aVar37 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar19 + 0x2c + lVar22)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar19 = *plVar2;
          lVar22 = plVar2[2] * uVar18;
          auVar118._8_8_ = 0;
          auVar118._0_8_ = *(ulong *)(lVar19 + 4 + lVar22);
          auVar137._8_8_ = 0;
          auVar137._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar22);
          auVar36 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + lVar22)),
                                       (undefined1  [16])_DAT_01fefe80,auVar118);
          auVar33 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                       (undefined1  [16])_DAT_01fefe80,auVar137);
          auVar119._8_8_ = 0;
          auVar119._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar22);
          auVar42 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)),
                                       (undefined1  [16])_DAT_01fefe80,auVar119);
          auVar177._8_8_ = 0;
          auVar177._0_8_ = *(ulong *)(lVar19 + 0x28 + lVar22);
          aVar37.v = (__m128)vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0x24 + lVar22)),
                                                _DAT_01fefe80,auVar177);
        }
      }
      else if (iVar115 == 0xb001) {
        lVar19 = *plVar2;
        lVar22 = plVar2[2] * uVar18;
        auVar83._8_8_ = 0;
        auVar83._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar22);
        auVar33 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(lVar19 + 8 + lVar22)),0x20);
        auVar84._8_8_ = 0;
        auVar84._0_8_ = *(ulong *)(lVar19 + 0x34 + lVar22);
        auVar39 = vpermt2ps_avx512vl(auVar84,_DAT_01fefe90,ZEXT416(*(uint *)(lVar19 + lVar22)));
        auVar178._8_8_ = 0;
        auVar178._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar22);
        fVar75 = *(float *)(lVar19 + 0x24 + lVar22);
        auVar34 = ZEXT416((uint)fVar75);
        fVar28 = *(float *)(lVar19 + 0x28 + lVar22);
        auVar45 = ZEXT416((uint)fVar28);
        fVar135 = *(float *)(lVar19 + 0x2c + lVar22);
        auVar36 = vpermt2ps_avx512vl(auVar178,_DAT_01fefe90,
                                     ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)));
        fVar172 = *(float *)(lVar19 + 0x30 + lVar22);
        auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),ZEXT416((uint)fVar75),
                                  ZEXT416((uint)fVar75));
        auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)fVar135),ZEXT416((uint)fVar135));
        auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
        auVar219._4_12_ = ZEXT812(0) << 0x20;
        auVar219._0_4_ = auVar35._0_4_;
        auVar42 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar219);
        fVar193 = auVar42._0_4_;
        fVar193 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar35._0_4_ * -0.5;
        aVar37 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vinsertps_avx(auVar36,ZEXT416((uint)(fVar193 * fVar75)),0x30);
        auVar36 = vinsertps_avx(auVar39,ZEXT416((uint)(fVar193 * fVar28)),0x30);
        auVar42 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar193 * fVar172)),0x30);
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                ZEXT416(*(uint *)(lVar19 + 4 + lVar22)),0x10);
        auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar19 + 0x3c + lVar22)),0x20);
        auVar33 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar135 * fVar193)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar19 = *plVar2;
        lVar22 = plVar2[2] * uVar18;
        auVar36 = *(undefined1 (*) [16])(lVar19 + lVar22);
        auVar33 = *(undefined1 (*) [16])(lVar19 + 0x10 + lVar22);
        auVar42 = *(undefined1 (*) [16])(lVar19 + 0x20 + lVar22);
        aVar37 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                  ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + 0x30 + lVar22))->v;
      }
      uVar150 = (undefined4)((ulong)lVar19 >> 0x20);
      fVar75 = 1.0 - fVar114;
      auVar38._4_4_ = fVar114;
      auVar38._0_4_ = fVar114;
      auVar38._8_4_ = fVar114;
      auVar38._12_4_ = fVar114;
      auVar85._0_4_ = fVar114 * auVar36._0_4_;
      auVar85._4_4_ = fVar114 * auVar36._4_4_;
      auVar85._8_4_ = fVar114 * auVar36._8_4_;
      auVar85._12_4_ = fVar114 * auVar36._12_4_;
      aVar40.v[1] = fVar75;
      aVar40.v[0] = fVar75;
      aVar40.v[2] = fVar75;
      aVar40.v[3] = fVar75;
      auVar29 = vfmadd213ps_avx512vl(auVar29,(undefined1  [16])aVar40,auVar85);
      auVar86._0_4_ = fVar114 * auVar33._0_4_;
      auVar86._4_4_ = fVar114 * auVar33._4_4_;
      auVar86._8_4_ = fVar114 * auVar33._8_4_;
      auVar86._12_4_ = fVar114 * auVar33._12_4_;
      auVar30 = vfmadd213ps_avx512vl(auVar30,(undefined1  [16])aVar40,auVar86);
      auVar87._0_4_ = fVar114 * auVar42._0_4_;
      auVar87._4_4_ = fVar114 * auVar42._4_4_;
      auVar87._8_4_ = fVar114 * auVar42._8_4_;
      auVar87._12_4_ = fVar114 * auVar42._12_4_;
      auVar31 = vfmadd213ps_avx512vl(auVar31,(undefined1  [16])aVar40,auVar87);
      auVar88._0_4_ = fVar114 * aVar37.v[0];
      auVar88._4_4_ = fVar114 * aVar37.v[1];
      auVar88._8_4_ = fVar114 * aVar37.v[2];
      auVar88._12_4_ = fVar114 * aVar37.v[3];
      auVar32 = vfmadd213ps_avx512vl(auVar32,(undefined1  [16])aVar40,auVar88);
    }
    fVar114 = (pGVar1->time_range).lower;
    fVar75 = (pGVar1->time_range).upper;
    auVar36 = ZEXT416((uint)fVar75);
    fVar114 = pGVar1->fnumTimeSegments * ((query->time - fVar114) / (fVar75 - fVar114));
    auVar33 = ZEXT416((uint)fVar114);
    auVar35 = vroundss_avx(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),9);
    auVar35 = vminss_avx(auVar35,ZEXT416((uint)(pGVar1->fnumTimeSegments + -1.0)));
    auVar39 = ZEXT816(0) << 0x20;
    auVar35 = vmaxss_avx(auVar39,auVar35);
    fVar114 = fVar114 - auVar35._0_4_;
    auVar42 = ZEXT416((uint)fVar114);
    iVar20 = (int)auVar35._0_4_;
    lVar19 = *(long *)&pGVar1[1].fnumTimeSegments;
    lVar22 = CONCAT44(uVar150,iVar20) * 0x38;
    plVar2 = (long *)(lVar19 + lVar22);
    iVar115 = *(int *)(lVar19 + 0x20 + lVar22);
    if ((pGVar1->field_8).field_0x1 == '\x01') {
      auVar33 = ZEXT416((uint)fVar114);
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar22 = *plVar2;
          lVar25 = plVar2[2] * uVar18;
          auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + lVar25)),
                                  ZEXT416(*(uint *)(lVar22 + 0x10 + lVar25)),0x1c);
          auVar44 = vinsertps_avx512f(auVar45,ZEXT416(*(uint *)(lVar22 + 0x20 + lVar25)),0x28);
          auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 4 + lVar25)),
                                  ZEXT416(*(uint *)(lVar22 + 0x14 + lVar25)),0x1c);
          auVar41 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar22 + 0x24 + lVar25)),0x28);
          auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 8 + lVar25)),
                                  ZEXT416(*(uint *)(lVar22 + 0x18 + lVar25)),0x1c);
          auVar46 = vinsertps_avx512f(auVar45,ZEXT416(*(uint *)(lVar22 + 0x28 + lVar25)),0x28);
          auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 0xc + lVar25)),
                                  ZEXT416(*(uint *)(lVar22 + 0x1c + lVar25)),0x1c);
          auVar42 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar22 + 0x2c + lVar25)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar22 = *plVar2;
          lVar25 = plVar2[2] * uVar18;
          auVar96._8_8_ = 0;
          auVar96._0_8_ = *(ulong *)(lVar22 + 4 + lVar25);
          auVar141._8_8_ = 0;
          auVar141._0_8_ = *(ulong *)(lVar22 + 0x10 + lVar25);
          auVar44 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + lVar25)),
                                       (undefined1  [16])_DAT_01fefe80,auVar96);
          auVar41 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0xc + lVar25)),
                                       (undefined1  [16])_DAT_01fefe80,auVar141);
          auVar97._8_8_ = 0;
          auVar97._0_8_ = *(ulong *)(lVar22 + 0x1c + lVar25);
          auVar46 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0x18 + lVar25)),
                                       (undefined1  [16])_DAT_01fefe80,auVar97);
          auVar98._8_8_ = 0;
          auVar98._0_8_ = *(ulong *)(lVar22 + 0x28 + lVar25);
          auVar42 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0x24 + lVar25)),
                                       (undefined1  [16])_DAT_01fefe80,auVar98);
        }
      }
      else if (iVar115 == 0xb001) {
        lVar22 = *plVar2;
        lVar25 = plVar2[2] * uVar18;
        auVar108._8_8_ = 0;
        auVar108._0_8_ = *(ulong *)(lVar22 + 0x10 + lVar25);
        auVar45 = vinsertps_avx(auVar108,ZEXT416(*(uint *)(lVar22 + 8 + lVar25)),0x20);
        auVar130._8_8_ = 0;
        auVar130._0_8_ = *(ulong *)(lVar22 + 0x34 + lVar25);
        auVar35 = vpermt2ps_avx512vl(auVar130,_DAT_01fefe90,ZEXT416(*(uint *)(lVar22 + lVar25)));
        auVar188._8_8_ = 0;
        auVar188._0_8_ = *(ulong *)(lVar22 + 0x1c + lVar25);
        fVar75 = *(float *)(lVar22 + 0x24 + lVar25);
        fVar28 = *(float *)(lVar22 + 0x28 + lVar25);
        fVar135 = *(float *)(lVar22 + 0x2c + lVar25);
        auVar39 = vpermt2ps_avx512vl(auVar188,_DAT_01fefe90,
                                     ZEXT416(*(uint *)(lVar22 + 0x18 + lVar25)));
        fVar172 = *(float *)(lVar22 + 0x30 + lVar25);
        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),ZEXT416((uint)fVar75),
                                  ZEXT416((uint)fVar75));
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar135),ZEXT416((uint)fVar135));
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
        auVar44 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar34._0_4_));
        fVar193 = auVar44._0_4_;
        fVar193 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar34._0_4_ * -0.5;
        auVar42 = vinsertps_avx(auVar39,ZEXT416((uint)(fVar75 * fVar193)),0x30);
        auVar44 = vinsertps_avx512f(auVar35,ZEXT416((uint)(fVar28 * fVar193)),0x30);
        auVar46 = vinsertps_avx512f(auVar45,ZEXT416((uint)(fVar172 * fVar193)),0x30);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 0xc + lVar25)),
                                ZEXT416(*(uint *)(lVar22 + 4 + lVar25)),0x10);
        auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar22 + 0x3c + lVar25)),0x20);
        auVar41 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar135 * fVar193)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar22 = *plVar2;
        lVar25 = plVar2[2] * uVar18;
        auVar44 = *(undefined1 (*) [16])(lVar22 + lVar25);
        auVar41 = *(undefined1 (*) [16])(lVar22 + 0x10 + lVar25);
        auVar46 = *(undefined1 (*) [16])(lVar22 + 0x20 + lVar25);
        auVar42 = *(undefined1 (*) [16])(lVar22 + 0x30 + lVar25);
      }
      lVar22 = (ulong)(iVar20 + 1) * 0x38;
      plVar2 = (long *)(lVar19 + lVar22);
      iVar115 = *(int *)(lVar19 + 0x20 + lVar22);
      auVar39 = auVar30;
      auVar45 = auVar29;
      auVar34 = auVar32;
      auVar35 = auVar31;
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar19 = *plVar2;
          lVar22 = uVar18 * plVar2[2];
          auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x10 + lVar22)),0x1c);
          auVar45 = vinsertps_avx512f(auVar45,ZEXT416(*(uint *)(lVar19 + 0x20 + lVar22)),0x28);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 4 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x14 + lVar22)),0x1c);
          auVar34 = vinsertps_avx512f(auVar34,ZEXT416(*(uint *)(lVar19 + 0x24 + lVar22)),0x28);
          auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 8 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)),0x1c);
          auVar35 = vinsertps_avx512f(auVar35,ZEXT416(*(uint *)(lVar19 + 0x28 + lVar22)),0x28);
          auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x1c + lVar22)),0x1c);
          auVar39 = vinsertps_avx512f(auVar39,ZEXT416(*(uint *)(lVar19 + 0x2c + lVar22)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar19 = *plVar2;
          lVar22 = uVar18 * plVar2[2];
          auVar109._8_8_ = 0;
          auVar109._0_8_ = *(ulong *)(lVar19 + 4 + lVar22);
          auVar144._8_8_ = 0;
          auVar144._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar22);
          auVar45 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + lVar22)),
                                       (undefined1  [16])_DAT_01fefe80,auVar109);
          auVar34 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                       (undefined1  [16])_DAT_01fefe80,auVar144);
          auVar110._8_8_ = 0;
          auVar110._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar22);
          auVar35 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)),
                                       (undefined1  [16])_DAT_01fefe80,auVar110);
          auVar111._8_8_ = 0;
          auVar111._0_8_ = *(ulong *)(lVar19 + 0x28 + lVar22);
          auVar39 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0x24 + lVar22)),
                                       (undefined1  [16])_DAT_01fefe80,auVar111);
        }
      }
      else if (iVar115 == 0xb001) {
        lVar19 = *plVar2;
        lVar22 = uVar18 * plVar2[2];
        auVar112._8_8_ = 0;
        auVar112._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar22);
        auVar34 = vinsertps_avx(auVar112,ZEXT416(*(uint *)(lVar19 + 8 + lVar22)),0x20);
        auVar131._8_8_ = 0;
        auVar131._0_8_ = *(ulong *)(lVar19 + 0x34 + lVar22);
        auVar35 = vpermt2ps_avx512vl(auVar131,_DAT_01fefe90,ZEXT416(*(uint *)(lVar19 + lVar22)));
        auVar189._8_8_ = 0;
        auVar189._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar22);
        fVar75 = *(float *)(lVar19 + 0x24 + lVar22);
        fVar28 = *(float *)(lVar19 + 0x28 + lVar22);
        fVar135 = *(float *)(lVar19 + 0x2c + lVar22);
        auVar39 = vpermt2ps_avx512vl(auVar189,_DAT_01fefe90,
                                     ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)));
        fVar172 = *(float *)(lVar19 + 0x30 + lVar22);
        auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),ZEXT416((uint)fVar75),
                                  ZEXT416((uint)fVar75));
        auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar135),ZEXT416((uint)fVar135));
        auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
        auVar222._4_12_ = ZEXT812(0) << 0x20;
        auVar222._0_4_ = auVar45._0_4_;
        auVar36 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar222);
        fVar193 = auVar36._0_4_;
        fVar193 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar45._0_4_ * -0.5;
        auVar39 = vinsertps_avx512f(auVar39,ZEXT416((uint)(fVar75 * fVar193)),0x30);
        auVar45 = vinsertps_avx512f(auVar35,ZEXT416((uint)(fVar28 * fVar193)),0x30);
        auVar35 = vinsertps_avx512f(auVar34,ZEXT416((uint)(fVar172 * fVar193)),0x30);
        auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                ZEXT416(*(uint *)(lVar19 + 4 + lVar22)),0x10);
        auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar19 + 0x3c + lVar22)),0x20);
        auVar34 = vinsertps_avx512f(auVar34,ZEXT416((uint)(fVar135 * fVar193)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar19 = *plVar2;
        lVar22 = uVar18 * plVar2[2];
        auVar45 = *(undefined1 (*) [16])(lVar19 + lVar22);
        auVar34 = *(undefined1 (*) [16])(lVar19 + 0x10 + lVar22);
        auVar35 = *(undefined1 (*) [16])(lVar19 + 0x20 + lVar22);
        auVar39 = *(undefined1 (*) [16])(lVar19 + 0x30 + lVar22);
      }
      auVar53 = vshufps_avx512vl(auVar42,auVar42,0xff);
      auVar54 = vshufps_avx512vl(auVar44,auVar44,0xff);
      auVar36 = vshufps_avx(auVar41,auVar41,0xff);
      auVar55 = vshufps_avx512vl(auVar46,auVar46,0xff);
      auVar43 = vshufps_avx512vl(auVar39,auVar39,0xff);
      auVar56 = vshufps_avx512vl(auVar45,auVar45,0xff);
      auVar57 = vshufps_avx512vl(auVar34,auVar34,0xff);
      auVar58 = vshufps_avx512vl(auVar35,auVar35,0xff);
      auVar59 = vmulss_avx512f(auVar54,auVar56);
      auVar59 = vfmadd231ss_avx512f(auVar59,auVar43,auVar53);
      auVar59 = vfmadd231ss_avx512f(auVar59,auVar57,auVar36);
      auVar59 = vfmadd231ss_avx512f(auVar59,auVar58,auVar55);
      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar61 = vxorps_avx512vl(auVar59,auVar60);
      bVar5 = auVar59._0_4_ < auVar61._0_4_;
      auVar38 = vxorps_avx512vl(auVar43,auVar60);
      auVar62 = vxorps_avx512vl(auVar56,auVar60);
      auVar63 = vxorps_avx512vl(auVar57,auVar60);
      auVar64 = vxorps_avx512vl(auVar58,auVar60);
      auVar65._4_12_ = auVar43._4_12_;
      auVar65._0_4_ = (uint)bVar5 * auVar38._0_4_ + (uint)!bVar5 * auVar43._0_4_;
      auVar66._4_12_ = auVar56._4_12_;
      auVar66._0_4_ = (uint)bVar5 * auVar62._0_4_ + (uint)!bVar5 * auVar56._0_4_;
      auVar67._4_12_ = auVar57._4_12_;
      auVar67._0_4_ = (uint)bVar5 * auVar63._0_4_ + (uint)!bVar5 * auVar57._0_4_;
      auVar68._4_12_ = auVar58._4_12_;
      auVar68._0_4_ = (uint)bVar5 * auVar64._0_4_ + (uint)!bVar5 * auVar58._0_4_;
      auVar16._8_4_ = 0x7fffffff;
      auVar16._0_8_ = 0x7fffffff7fffffff;
      auVar16._12_4_ = 0x7fffffff;
      auVar56 = vandps_avx512vl(auVar59,auVar16);
      auVar43 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbb8d3753),0),auVar56,ZEXT416(0x3c9df1b8));
      auVar43 = vfmadd213ss_fma(auVar43,auVar56,ZEXT416(0xbd37e81c));
      auVar43 = vfmadd213ss_fma(auVar43,auVar56,ZEXT416(0x3db3edac));
      auVar43 = vfmadd213ss_fma(auVar43,auVar56,ZEXT416(0xbe5ba881));
      auVar43 = vfmadd213ss_fma(auVar43,auVar56,ZEXT416(0x3fc90fd1));
      auVar57 = vmaxss_avx512f(auVar61,auVar59);
      auVar58 = vsubss_avx512f(ZEXT416(0x3f800000),auVar56);
      auVar59 = ZEXT816(0) << 0x20;
      if (auVar58._0_4_ < 0.0) {
        local_b8 = auVar56;
        local_a8 = auVar65;
        fVar75 = sqrtf(auVar58._0_4_);
        auVar59 = ZEXT816(0) << 0x40;
        auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar57 = ZEXT416(auVar57._0_4_);
        auVar65 = local_a8;
        auVar56 = local_b8;
      }
      else {
        auVar58 = vsqrtss_avx(auVar58,auVar58);
        fVar75 = auVar58._0_4_;
      }
      auVar38 = ZEXT416(0x3f800000);
      auVar43 = vmaxss_avx(auVar59,ZEXT416((uint)(1.5707964 - fVar75 * auVar43._0_4_)));
      auVar58 = vxorps_avx512vl(auVar43,auVar60);
      uVar4 = vcmpss_avx512f(auVar57,auVar59,1);
      bVar5 = (bool)((byte)uVar4 & 1);
      uVar4 = vcmpss_avx512f(auVar38,auVar56,1);
      bVar7 = (bool)((byte)uVar4 & 1);
      fVar75 = fVar114 * (float)((uint)bVar7 * 0x7fc00000 +
                                (uint)!bVar7 *
                                (int)(1.5707964 -
                                     (float)((uint)bVar5 * auVar58._0_4_ +
                                            (uint)!bVar5 * auVar43._0_4_)));
      auVar43 = ZEXT416((uint)(fVar75 * 0.63661975));
      auVar43 = vroundss_avx(auVar43,auVar43,9);
      auVar56 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3fc90fdb),0),auVar43,ZEXT416((uint)fVar75));
      uVar24 = (int)auVar43._0_4_ & 3;
      uVar21 = uVar24 - 1;
      fVar28 = auVar56._0_4_;
      fVar75 = fVar28 * fVar28;
      auVar56 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb2d70013),0),ZEXT416((uint)fVar75),
                                ZEXT416(0x363938a8));
      auVar58 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb48b634d),0),ZEXT416((uint)fVar75),
                                ZEXT416(0x37cfab9c));
      auVar59 = ZEXT416((uint)fVar75);
      auVar56 = vfmadd213ss_fma(auVar56,auVar59,ZEXT416(0xb9501096));
      auVar58 = vfmadd213ss_fma(auVar58,auVar59,ZEXT416(0xbab60981));
      auVar56 = vfmadd213ss_fma(auVar56,auVar59,ZEXT416(0x3c088898));
      auVar58 = vfmadd213ss_fma(auVar58,auVar59,ZEXT416(0x3d2aaaa4));
      auVar59 = ZEXT416((uint)fVar75);
      auVar56 = vfmadd213ss_fma(auVar56,auVar59,ZEXT416(0xbe2aaaab));
      auVar58 = vfmadd213ss_fma(auVar58,auVar59,SUB6416(ZEXT464(0xbf000000),0));
      auVar56 = vfmadd213ss_avx512f(auVar56,auVar59,auVar38);
      auVar58 = vfmadd213ss_avx512f(auVar58,auVar59,auVar38);
      fVar28 = fVar28 * auVar56._0_4_;
      bVar6 = (byte)(int)auVar43._0_4_;
      uVar27 = (uint)(bVar6 & 1) * auVar58._0_4_ + (uint)!(bool)(bVar6 & 1) * (int)fVar28;
      auVar69._4_12_ = auVar58._4_12_;
      auVar69._0_4_ = (uint)(bVar6 & 1) * (int)fVar28 + (uint)!(bool)(bVar6 & 1) * auVar58._0_4_;
      auVar43 = vxorps_avx512vl(auVar69,auVar60);
      auVar70._0_4_ = (uint)(uVar21 < 2) * auVar43._0_4_ + (uint)(uVar21 >= 2) * auVar69._0_4_;
      auVar70._4_12_ = auVar69._4_12_;
      auVar56 = vfmsub213ss_avx512f(auVar53,auVar57,auVar65);
      auVar43 = vfmsub213ss_avx512f(auVar54,auVar57,auVar66);
      auVar58 = vfmsub213ss_avx512f(auVar36,auVar57,auVar67);
      auVar57 = vfmsub213ss_avx512f(auVar55,auVar57,auVar68);
      fVar135 = auVar43._0_4_;
      auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * fVar135)),auVar56,auVar56);
      auVar43 = vfmadd231ss_fma(auVar43,auVar58,auVar58);
      auVar43 = vfmadd231ss_fma(auVar43,auVar57,auVar57);
      auVar113._12_4_ = 0;
      auVar113._0_12_ = ZEXT812(0);
      auVar113 = auVar113 << 0x20;
      auVar59 = vrsqrt14ss_avx512f(auVar113,ZEXT416((uint)auVar43._0_4_));
      fVar75 = auVar59._0_4_;
      fVar75 = fVar75 * 1.5 + fVar75 * fVar75 * fVar75 * auVar43._0_4_ * -0.5;
      auVar43 = vxorps_avx512vl(ZEXT416(uVar27),auVar60);
      fVar28 = (float)((1 < uVar24) * uVar27 + (uint)(1 >= uVar24) * auVar43._0_4_);
      auVar59 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar28 * fVar75 * auVar56._0_4_)),auVar70,auVar53
                                   );
      auVar61 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar28 * fVar75 * fVar135)),auVar70,auVar54);
      auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar75 * auVar58._0_4_ * fVar28)),auVar70,auVar36);
      auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar75 * auVar57._0_4_)),auVar55,auVar70);
      auVar57 = vsubss_avx512f(auVar38,auVar33);
      auVar58 = vmulss_avx512f(auVar33,auVar65);
      auVar58 = vfmadd231ss_avx512f(auVar58,auVar57,auVar53);
      auVar53 = vmulss_avx512f(auVar33,auVar66);
      auVar53 = vfmadd231ss_avx512f(auVar53,auVar57,auVar54);
      auVar54 = vmulss_avx512f(auVar33,auVar67);
      auVar36 = vfmadd231ss_fma(auVar54,auVar57,auVar36);
      auVar33 = vmulss_avx512f(auVar33,auVar68);
      auVar33 = vfmadd231ss_fma(auVar33,auVar57,auVar55);
      fVar28 = auVar53._0_4_;
      auVar53 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),auVar58,auVar58);
      auVar53 = vfmadd231ss_fma(auVar53,auVar36,auVar36);
      auVar53 = vfmadd231ss_fma(auVar53,auVar33,auVar33);
      auVar54 = vrsqrt14ss_avx512f(auVar113,ZEXT416((uint)auVar53._0_4_));
      fVar75 = auVar54._0_4_;
      fVar75 = fVar75 * 1.5 + fVar75 * fVar75 * fVar75 * auVar53._0_4_ * -0.5;
      vucomiss_avx512f(ZEXT416(0x3f7fdf3b));
      bVar5 = 2 < uVar21;
      auVar71._4_12_ = auVar59._4_12_;
      auVar71._0_4_ =
           (float)((uint)bVar5 * (int)(auVar58._0_4_ * fVar75) + (uint)!bVar5 * auVar59._0_4_);
      auVar72._4_12_ = auVar61._4_12_;
      auVar72._0_4_ = (float)((uint)bVar5 * (int)(fVar28 * fVar75) + (uint)!bVar5 * auVar61._0_4_);
      auVar73._4_12_ = auVar43._4_12_;
      auVar73._0_4_ =
           (float)((uint)bVar5 * (int)(auVar36._0_4_ * fVar75) + (uint)!bVar5 * auVar43._0_4_);
      auVar74._4_12_ = auVar56._4_12_;
      auVar74._0_4_ =
           (float)((uint)bVar5 * (int)(auVar33._0_4_ * fVar75) + (uint)!bVar5 * auVar56._0_4_);
      auVar190._4_4_ = fVar114;
      auVar190._0_4_ = fVar114;
      auVar190._8_4_ = fVar114;
      auVar190._12_4_ = fVar114;
      auVar33 = vmulps_avx512vl(auVar190,auVar45);
      auVar201._0_4_ = auVar57._0_4_;
      auVar201._4_4_ = auVar201._0_4_;
      auVar201._8_4_ = auVar201._0_4_;
      auVar201._12_4_ = auVar201._0_4_;
      auVar43 = vfmadd213ps_avx512vl(auVar44,auVar201,auVar33);
      auVar33 = vmulps_avx512vl(auVar190,auVar34);
      auVar33 = vfmadd213ps_fma(auVar41,auVar201,auVar33);
      auVar45 = vmulps_avx512vl(auVar190,auVar35);
      auVar41 = vfmadd213ps_avx512vl(auVar46,auVar201,auVar45);
      auVar45 = vmulps_avx512vl(auVar190,auVar39);
      auVar34 = vfmadd213ps_fma(auVar42,auVar201,auVar45);
      auVar45 = vshufps_avx512vl(auVar43,auVar113,0xe9);
      auVar45 = vblendps_avx(auVar45,auVar33,4);
      auVar35 = vfmadd213ss_fma(auVar71,auVar71,ZEXT416((uint)(auVar72._0_4_ * auVar72._0_4_)));
      auVar35 = vfnmadd231ss_fma(auVar35,auVar73,auVar73);
      auVar44 = vfnmadd231ss_fma(auVar35,auVar74,auVar74);
      auVar35 = vfmadd213ss_fma(auVar73,auVar72,ZEXT416((uint)(auVar71._0_4_ * auVar74._0_4_)));
      fVar114 = auVar35._0_4_ + auVar35._0_4_;
      auVar35 = vfmsub213ss_fma(auVar74,auVar72,ZEXT416((uint)(auVar71._0_4_ * auVar73._0_4_)));
      fVar75 = auVar35._0_4_ + auVar35._0_4_;
      auVar35 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar74._0_4_)),auVar72,auVar73);
      fVar28 = auVar35._0_4_ + auVar35._0_4_;
      auVar39 = vfmsub231ss_fma(ZEXT416((uint)(auVar72._0_4_ * auVar72._0_4_)),auVar71,auVar71);
      auVar35 = vfmadd213ss_fma(auVar73,auVar73,auVar39);
      auVar36 = vfnmadd231ss_fma(auVar35,auVar74,auVar74);
      auVar35 = vfmadd213ss_fma(auVar74,auVar73,ZEXT416((uint)(auVar71._0_4_ * auVar72._0_4_)));
      fVar135 = auVar35._0_4_ + auVar35._0_4_;
      auVar35 = vfmadd213ss_fma(auVar72,auVar74,ZEXT416((uint)(auVar71._0_4_ * auVar73._0_4_)));
      fVar172 = auVar35._0_4_ + auVar35._0_4_;
      auVar35 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar72._0_4_)),auVar73,auVar74);
      fVar193 = auVar35._0_4_ + auVar35._0_4_;
      auVar35 = vfnmadd231ss_fma(auVar39,auVar73,auVar73);
      auVar46 = vfmadd231ss_fma(auVar35,auVar74,auVar74);
      uVar150 = auVar44._0_4_;
      auVar132._4_4_ = uVar150;
      auVar132._0_4_ = uVar150;
      auVar132._8_4_ = uVar150;
      auVar132._12_4_ = uVar150;
      auVar145._4_4_ = fVar114;
      auVar145._0_4_ = fVar114;
      auVar145._8_4_ = fVar114;
      auVar145._12_4_ = fVar114;
      auVar218._0_4_ = fVar75 * 0.0;
      auVar218._4_4_ = fVar75 * 0.0;
      auVar218._8_4_ = fVar75 * 1.0;
      auVar218._12_4_ = fVar75 * 0.0;
      auVar42 = ZEXT816(0x3f80000000000000);
      auVar35 = vfmadd231ps_fma(auVar218,auVar42,auVar145);
      auVar56 = SUB6416(ZEXT464(0x3f800000),0);
      auVar39 = vfmadd231ps_fma(auVar35,auVar56,auVar132);
      auVar133._4_4_ = fVar28;
      auVar133._0_4_ = fVar28;
      auVar133._8_4_ = fVar28;
      auVar133._12_4_ = fVar28;
      uVar150 = auVar36._0_4_;
      auVar146._4_4_ = uVar150;
      auVar146._0_4_ = uVar150;
      auVar146._8_4_ = uVar150;
      auVar146._12_4_ = uVar150;
      auVar213._0_4_ = fVar135 * 0.0;
      auVar213._4_4_ = fVar135 * 0.0;
      auVar213._8_4_ = fVar135 * 1.0;
      auVar213._12_4_ = fVar135 * 0.0;
      auVar35 = vfmadd231ps_fma(auVar213,auVar42,auVar146);
      auVar44 = vfmadd231ps_fma(auVar35,auVar56,auVar133);
      auVar134._4_4_ = fVar172;
      auVar134._0_4_ = fVar172;
      auVar134._8_4_ = fVar172;
      auVar134._12_4_ = fVar172;
      auVar147._4_4_ = fVar193;
      auVar147._0_4_ = fVar193;
      auVar147._8_4_ = fVar193;
      auVar147._12_4_ = fVar193;
      fVar114 = auVar46._0_4_;
      auVar160._0_4_ = fVar114 * 0.0;
      auVar160._4_4_ = fVar114 * 0.0;
      auVar160._8_4_ = fVar114 * 1.0;
      auVar160._12_4_ = fVar114 * 0.0;
      auVar35 = vfmadd231ps_fma(auVar160,auVar42,auVar147);
      auVar35 = vfmadd231ps_fma(auVar35,auVar56,auVar134);
      auVar46 = vbroadcastss_avx512vl(auVar43);
      fVar114 = auVar35._0_4_;
      auVar148._0_4_ = fVar114 * 0.0;
      fVar75 = auVar35._4_4_;
      auVar148._4_4_ = fVar75 * 0.0;
      fVar28 = auVar35._8_4_;
      auVar148._8_4_ = fVar28 * 0.0;
      fVar135 = auVar35._12_4_;
      auVar148._12_4_ = fVar135 * 0.0;
      auVar35 = vfmadd213ps_fma(auVar113,auVar44,auVar148);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar35,auVar39,auVar46);
      uVar150 = auVar33._0_4_;
      auVar191._4_4_ = uVar150;
      auVar191._0_4_ = uVar150;
      auVar191._8_4_ = uVar150;
      auVar191._12_4_ = uVar150;
      auVar33 = vshufps_avx(auVar33,auVar33,0x55);
      auVar33 = vfmadd213ps_fma(auVar33,auVar44,auVar148);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ps_fma(auVar33,auVar39,auVar191);
      auVar35 = vbroadcastss_avx512vl(auVar41);
      auVar33 = vshufps_avx512vl(auVar41,auVar41,0x55);
      auVar46 = vshufps_avx512vl(auVar41,auVar41,0xaa);
      auVar149._0_4_ = auVar46._0_4_ * fVar114;
      auVar149._4_4_ = auVar46._4_4_ * fVar75;
      auVar149._8_4_ = auVar46._8_4_ * fVar28;
      auVar149._12_4_ = auVar46._12_4_ * fVar135;
      auVar33 = vfmadd231ps_fma(auVar149,auVar44,auVar33);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar33,auVar39,auVar35);
      uVar150 = auVar34._0_4_;
      auVar192._4_4_ = uVar150;
      auVar192._0_4_ = uVar150;
      auVar192._8_4_ = uVar150;
      auVar192._12_4_ = uVar150;
      auVar33 = vshufps_avx(auVar34,auVar34,0x55);
      auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
      auVar161._0_4_ = auVar34._0_4_ * fVar114;
      auVar161._4_4_ = auVar34._4_4_ * fVar75;
      auVar161._8_4_ = auVar34._8_4_ * fVar28;
      auVar161._12_4_ = auVar34._12_4_ * fVar135;
      auVar33 = vfmadd231ps_fma(auVar161,auVar44,auVar33);
      auVar34 = vfmadd231ps_fma(auVar33,auVar39,auVar192);
      auVar33._0_4_ = auVar45._0_4_ + 0.0 + auVar34._0_4_;
      auVar33._4_4_ = auVar45._4_4_ + 0.0 + auVar34._4_4_;
      auVar33._8_4_ = auVar45._8_4_ + 0.0 + auVar34._8_4_;
      auVar33._12_4_ = auVar45._12_4_ + 0.0 + auVar34._12_4_;
    }
    else {
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar22 = *plVar2;
          lVar25 = plVar2[2] * uVar18;
          auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + lVar25)),
                                  ZEXT416(*(uint *)(lVar22 + 0x10 + lVar25)),0x1c);
          auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar22 + 0x20 + lVar25)),0x28);
          auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 4 + lVar25)),
                                  ZEXT416(*(uint *)(lVar22 + 0x14 + lVar25)),0x1c);
          auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar22 + 0x24 + lVar25)),0x28);
          auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 8 + lVar25)),
                                  ZEXT416(*(uint *)(lVar22 + 0x18 + lVar25)),0x1c);
          auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar22 + 0x28 + lVar25)),0x28);
          auVar44 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 0xc + lVar25)),
                                  ZEXT416(*(uint *)(lVar22 + 0x1c + lVar25)),0x1c);
          auVar36 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(lVar22 + 0x2c + lVar25)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar22 = *plVar2;
          lVar25 = plVar2[2] * uVar18;
          auVar138._8_8_ = 0;
          auVar138._0_8_ = *(ulong *)(lVar22 + 4 + lVar25);
          auVar153._8_8_ = 0;
          auVar153._0_8_ = *(ulong *)(lVar22 + 0x10 + lVar25);
          auVar33 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + lVar25)),
                                       (undefined1  [16])_DAT_01fefe80,auVar138);
          auVar35 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0xc + lVar25)),
                                       (undefined1  [16])_DAT_01fefe80,auVar153);
          auVar154._8_8_ = 0;
          auVar154._0_8_ = *(ulong *)(lVar22 + 0x1c + lVar25);
          auVar39 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0x18 + lVar25)),
                                       (undefined1  [16])_DAT_01fefe80,auVar154);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)(lVar22 + 0x28 + lVar25);
          auVar36 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0x24 + lVar25)),
                                       (undefined1  [16])_DAT_01fefe80,auVar38);
          aVar40 = _DAT_01fefe80;
        }
      }
      else if (iVar115 == 0xb001) {
        lVar22 = *plVar2;
        lVar25 = plVar2[2] * uVar18;
        auVar89._8_8_ = 0;
        auVar89._0_8_ = *(ulong *)(lVar22 + 0x10 + lVar25);
        auVar35 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(lVar22 + 8 + lVar25)),0x20);
        auVar90._8_8_ = 0;
        auVar90._0_8_ = *(ulong *)(lVar22 + 0x34 + lVar25);
        uVar24 = *(uint *)(lVar22 + 0xc + lVar25);
        aVar40 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar24);
        auVar39 = vpermt2ps_avx512vl(auVar90,_DAT_01fefe90,ZEXT416(*(uint *)(lVar22 + lVar25)));
        auVar179._8_8_ = 0;
        auVar179._0_8_ = *(ulong *)(lVar22 + 0x1c + lVar25);
        fVar75 = *(float *)(lVar22 + 0x24 + lVar25);
        auVar34 = ZEXT416((uint)fVar75);
        fVar28 = *(float *)(lVar22 + 0x28 + lVar25);
        auVar45 = ZEXT416((uint)fVar28);
        fVar135 = *(float *)(lVar22 + 0x2c + lVar25);
        auVar44 = vpermt2ps_avx512vl(auVar179,_DAT_01fefe90,
                                     ZEXT416(*(uint *)(lVar22 + 0x18 + lVar25)));
        fVar172 = *(float *)(lVar22 + 0x30 + lVar25);
        auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),ZEXT416((uint)fVar75),
                                  ZEXT416((uint)fVar75));
        auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar135),ZEXT416((uint)fVar135));
        auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
        auVar46 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar33._0_4_));
        fVar193 = auVar46._0_4_;
        fVar193 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar33._0_4_ * -0.5;
        auVar36 = vinsertps_avx(auVar44,ZEXT416((uint)(fVar193 * fVar75)),0x30);
        auVar33 = vinsertps_avx(auVar39,ZEXT416((uint)(fVar193 * fVar28)),0x30);
        auVar38 = ZEXT416((uint)(fVar135 * fVar193));
        auVar39 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar193 * fVar172)),0x30);
        auVar35 = vinsertps_avx(ZEXT416(uVar24),ZEXT416(*(uint *)(lVar22 + 4 + lVar25)),0x10);
        auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar22 + 0x3c + lVar25)),0x20);
        auVar35 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar135 * fVar193)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar22 = *plVar2;
        lVar25 = plVar2[2] * uVar18;
        auVar33 = *(undefined1 (*) [16])(lVar22 + lVar25);
        auVar35 = *(undefined1 (*) [16])(lVar22 + 0x10 + lVar25);
        auVar39 = *(undefined1 (*) [16])(lVar22 + 0x20 + lVar25);
        auVar36 = *(undefined1 (*) [16])(lVar22 + 0x30 + lVar25);
      }
      lVar22 = (ulong)(iVar20 + 1) * 0x38;
      plVar2 = (long *)(lVar19 + lVar22);
      iVar115 = *(int *)(lVar19 + 0x20 + lVar22);
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar19 = *plVar2;
          lVar22 = uVar18 * plVar2[2];
          auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x10 + lVar22)),0x1c);
          aVar40 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar19 + 0x20 + lVar22)),0x28);
          auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 4 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x14 + lVar22)),0x1c);
          auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar19 + 0x24 + lVar22)),0x28);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 8 + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)),0x1c);
          auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar19 + 0x28 + lVar22)),0x28);
          auVar44 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                  ZEXT416(*(uint *)(lVar19 + 0x1c + lVar22)),0x1c);
          auVar38 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(lVar19 + 0x2c + lVar22)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar19 = *plVar2;
          lVar22 = uVar18 * plVar2[2];
          auVar180._8_8_ = 0;
          auVar180._0_8_ = *(ulong *)(lVar19 + 4 + lVar22);
          auVar195._8_8_ = 0;
          auVar195._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar22);
          aVar40.v = (__m128)vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + lVar22)),_DAT_01fefe80,
                                                auVar180);
          auVar45 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                       (undefined1  [16])_DAT_01fefe80,auVar195);
          auVar181._8_8_ = 0;
          auVar181._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar22);
          auVar34 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)),
                                       (undefined1  [16])_DAT_01fefe80,auVar181);
          auVar214._8_8_ = 0;
          auVar214._0_8_ = *(ulong *)(lVar19 + 0x28 + lVar22);
          auVar38 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar19 + 0x24 + lVar22)),
                                       (undefined1  [16])_DAT_01fefe80,auVar214);
        }
      }
      else if (iVar115 == 0xb001) {
        lVar19 = *plVar2;
        lVar22 = uVar18 * plVar2[2];
        auVar162._8_8_ = 0;
        auVar162._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar22);
        auVar45 = vinsertps_avx(auVar162,ZEXT416(*(uint *)(lVar19 + 8 + lVar22)),0x20);
        auVar163._8_8_ = 0;
        auVar163._0_8_ = *(ulong *)(lVar19 + 0x34 + lVar22);
        auVar44 = vpermt2ps_avx512vl(auVar163,_DAT_01fefe90,ZEXT416(*(uint *)(lVar19 + lVar22)));
        auVar215._8_8_ = 0;
        auVar215._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar22);
        fVar75 = *(float *)(lVar19 + 0x24 + lVar22);
        fVar28 = *(float *)(lVar19 + 0x28 + lVar22);
        fVar135 = *(float *)(lVar19 + 0x2c + lVar22);
        auVar46 = vpermt2ps_avx512vl(auVar215,_DAT_01fefe90,
                                     ZEXT416(*(uint *)(lVar19 + 0x18 + lVar22)));
        fVar172 = *(float *)(lVar19 + 0x30 + lVar22);
        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),ZEXT416((uint)fVar75),
                                  ZEXT416((uint)fVar75));
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar135),ZEXT416((uint)fVar135));
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
        auVar227._4_12_ = ZEXT812(0) << 0x20;
        auVar227._0_4_ = auVar34._0_4_;
        auVar42 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar227);
        fVar193 = auVar42._0_4_;
        fVar193 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar34._0_4_ * -0.5;
        auVar38 = vinsertps_avx(auVar46,ZEXT416((uint)(fVar75 * fVar193)),0x30);
        aVar40 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vinsertps_avx(auVar44,ZEXT416((uint)(fVar28 * fVar193)),0x30);
        auVar34 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar193 * fVar172)),0x30);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar22)),
                                ZEXT416(*(uint *)(lVar19 + 4 + lVar22)),0x10);
        auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar19 + 0x3c + lVar22)),0x20);
        auVar45 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar135 * fVar193)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar19 = *plVar2;
        lVar22 = uVar18 * plVar2[2];
        aVar40 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                  ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + lVar22))->v;
        auVar45 = *(undefined1 (*) [16])(lVar19 + 0x10 + lVar22);
        auVar34 = *(undefined1 (*) [16])(lVar19 + 0x20 + lVar22);
        auVar38 = *(undefined1 (*) [16])(lVar19 + 0x30 + lVar22);
      }
      fVar75 = 1.0 - fVar114;
      auVar164._0_4_ = fVar114 * aVar40.v[0];
      auVar164._4_4_ = fVar114 * aVar40.v[1];
      auVar164._8_4_ = fVar114 * aVar40.v[2];
      auVar164._12_4_ = fVar114 * aVar40.v[3];
      auVar207._4_4_ = fVar75;
      auVar207._0_4_ = fVar75;
      auVar207._8_4_ = fVar75;
      auVar207._12_4_ = fVar75;
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd213ps_fma(auVar33,auVar207,auVar164);
      auVar165._0_4_ = fVar114 * auVar45._0_4_;
      auVar165._4_4_ = fVar114 * auVar45._4_4_;
      auVar165._8_4_ = fVar114 * auVar45._8_4_;
      auVar165._12_4_ = fVar114 * auVar45._12_4_;
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd213ps_fma(auVar35,auVar207,auVar165);
      auVar166._0_4_ = fVar114 * auVar34._0_4_;
      auVar166._4_4_ = fVar114 * auVar34._4_4_;
      auVar166._8_4_ = fVar114 * auVar34._8_4_;
      auVar166._12_4_ = fVar114 * auVar34._12_4_;
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd213ps_fma(auVar39,auVar207,auVar166);
      auVar167._0_4_ = fVar114 * auVar38._0_4_;
      auVar167._4_4_ = fVar114 * auVar38._4_4_;
      auVar167._8_4_ = fVar114 * auVar38._8_4_;
      auVar167._12_4_ = fVar114 * auVar38._12_4_;
      auVar33 = vfmadd213ps_fma(auVar36,auVar207,auVar167);
    }
  }
  auVar45 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
  auVar34 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
  auVar196._0_4_ = a0_1.field_0._0_4_ * auVar34._0_4_;
  auVar196._4_4_ = a0_1.field_0._4_4_ * auVar34._4_4_;
  auVar196._8_4_ = a0_1.field_0._8_4_ * auVar34._8_4_;
  auVar196._12_4_ = a0_1.field_0._12_4_ * auVar34._12_4_;
  auVar44 = vfmsub231ps_fma(auVar196,(undefined1  [16])a0.field_0,auVar45);
  auVar35 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar39 = vshufps_avx((undefined1  [16])a0_2.field_0,(undefined1  [16])a0_2.field_0,0xc9);
  auVar168._0_4_ = a0_2.field_0._0_4_ * auVar45._0_4_;
  auVar168._4_4_ = a0_2.field_0._4_4_ * auVar45._4_4_;
  auVar168._8_4_ = a0_2.field_0._8_4_ * auVar45._8_4_;
  auVar168._12_4_ = a0_2.field_0._12_4_ * auVar45._12_4_;
  auVar46 = vfmsub231ps_fma(auVar168,auVar39,(undefined1  [16])a0_1.field_0);
  auVar120._0_4_ = auVar39._0_4_ * a0.field_0._0_4_;
  auVar120._4_4_ = auVar39._4_4_ * a0.field_0._4_4_;
  auVar120._8_4_ = auVar39._8_4_ * a0.field_0._8_4_;
  auVar120._12_4_ = auVar39._12_4_ * a0.field_0._12_4_;
  auVar39 = vfmsub231ps_fma(auVar120,(undefined1  [16])a0_2.field_0,auVar34);
  auVar45 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar34 = vunpcklps_avx(auVar35,auVar45);
  auVar39 = vunpcklps_avx(auVar44,auVar39);
  auVar45 = vinsertps_avx(auVar46,auVar46,0x4a);
  auVar39 = vunpcklps_avx(auVar39,ZEXT416(auVar46._0_4_));
  auVar44 = vunpcklps_avx(auVar34,auVar45);
  auVar34 = vunpckhps_avx(auVar34,auVar45);
  auVar45 = vdpps_avx((undefined1  [16])a0_2.field_0,auVar35,0x7f);
  auVar91._0_4_ = auVar45._0_4_;
  auVar91._4_4_ = auVar91._0_4_;
  auVar91._8_4_ = auVar91._0_4_;
  auVar91._12_4_ = auVar91._0_4_;
  auVar45 = vdivps_avx(auVar44,auVar91);
  auVar34 = vdivps_avx(auVar34,auVar91);
  auVar35 = vdivps_avx(auVar39,auVar91);
  uVar150 = auVar33._0_4_;
  auVar92._4_4_ = uVar150;
  auVar92._0_4_ = uVar150;
  auVar92._8_4_ = uVar150;
  auVar92._12_4_ = uVar150;
  auVar39 = vshufps_avx(auVar33,auVar33,0x55);
  auVar33 = vshufps_avx(auVar33,auVar33,0xaa);
  auVar139._0_4_ = auVar33._0_4_ * auVar35._0_4_;
  auVar139._4_4_ = auVar33._4_4_ * auVar35._4_4_;
  auVar139._8_4_ = auVar33._8_4_ * auVar35._8_4_;
  auVar139._12_4_ = auVar33._12_4_ * auVar35._12_4_;
  auVar33 = vfmadd231ps_fma(auVar139,auVar34,auVar39);
  auVar33 = vfmadd231ps_fma(auVar33,auVar45,auVar92);
  auVar8._8_4_ = 0x80000000;
  auVar8._0_8_ = 0x8000000080000000;
  auVar8._12_4_ = 0x80000000;
  auVar33 = vxorps_avx512vl(auVar33,auVar8);
  uVar150 = 2;
  bVar5 = true;
  local_68 = 0.0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar39 = vdpps_avx(auVar45,auVar34,0x7f);
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar39 = vandps_avx512vl(auVar39,auVar9);
    if (auVar39._0_4_ <= 1e-05) {
      auVar39 = vdpps_avx(auVar45,auVar35,0x7f);
      auVar10._8_4_ = 0x7fffffff;
      auVar10._0_8_ = 0x7fffffff7fffffff;
      auVar10._12_4_ = 0x7fffffff;
      auVar39 = vandps_avx512vl(auVar39,auVar10);
      if (auVar39._0_4_ <= 1e-05) {
        auVar39 = vdpps_avx(auVar34,auVar35,0x7f);
        auVar11._8_4_ = 0x7fffffff;
        auVar11._0_8_ = 0x7fffffff7fffffff;
        auVar11._12_4_ = 0x7fffffff;
        auVar39 = vandps_avx512vl(auVar39,auVar11);
        if (auVar39._0_4_ <= 1e-05) {
          auVar44 = vdpps_avx(auVar45,auVar45,0x7f);
          auVar46 = vdpps_avx(auVar34,auVar34,0x7f);
          fVar114 = auVar44._0_4_;
          auVar155._8_4_ = 0x7fffffff;
          auVar155._0_8_ = 0x7fffffff7fffffff;
          auVar155._12_4_ = 0x7fffffff;
          auVar39 = vandps_avx(ZEXT416((uint)(fVar114 - auVar46._0_4_)),auVar155);
          if (auVar39._0_4_ <= 1e-05) {
            auVar36 = vdpps_avx(auVar35,auVar35,0x7f);
            auVar39 = vandps_avx(ZEXT416((uint)(fVar114 - auVar36._0_4_)),auVar155);
            local_68 = 0.0;
            if ((auVar39._0_4_ <= 1e-05) &&
               (auVar39 = vandps_avx(ZEXT416((uint)(auVar46._0_4_ - auVar36._0_4_)),auVar155),
               auVar39._0_4_ <= 1e-05)) {
              uVar150 = 1;
              if (fVar114 < 0.0) {
                local_68 = sqrtf(fVar114);
              }
              else {
                auVar39 = vsqrtss_avx(auVar44,auVar44);
                local_68 = auVar39._0_4_;
              }
              bVar5 = false;
            }
          }
        }
      }
    }
  }
  pRVar3 = context->userContext;
  uVar24 = pRVar3->instStackSize;
  auVar121._8_8_ = 0;
  auVar121._0_4_ = prim->primID_;
  auVar121._4_4_ = prim->instID_;
  auVar39 = vprolq_avx512vl(auVar121,0x20);
  *(long *)(pRVar3->instID + uVar24) = auVar39._0_8_;
  *(undefined1 (*) [16])pRVar3->world2inst[uVar24] = auVar45;
  *(undefined1 (*) [16])(pRVar3->world2inst[uVar24] + 4) = auVar34;
  *(undefined1 (*) [16])(pRVar3->world2inst[uVar24] + 8) = auVar35;
  *(undefined1 (*) [16])(pRVar3->world2inst[uVar24] + 0xc) = auVar33;
  *(undefined1 (*) [16])pRVar3->inst2world[uVar24] = auVar29;
  *(undefined1 (*) [16])(pRVar3->inst2world[uVar24] + 4) = auVar30;
  *(undefined1 (*) [16])(pRVar3->inst2world[uVar24] + 8) = auVar31;
  *(undefined1 (*) [16])(pRVar3->inst2world[uVar24] + 0xc) = auVar32;
  pRVar3->instStackSize = pRVar3->instStackSize + 1;
  local_cc = query->time;
  uVar194 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  auVar12._4_4_ = uVar194;
  auVar12._0_4_ = uVar194;
  auVar12._8_4_ = uVar194;
  auVar12._12_4_ = uVar194;
  auVar29 = vfmadd132ps_avx512vl(auVar35,auVar33,auVar12);
  uVar194 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  auVar13._4_4_ = uVar194;
  auVar13._0_4_ = uVar194;
  auVar13._8_4_ = uVar194;
  auVar13._12_4_ = uVar194;
  auVar29 = vfmadd231ps_avx512vl(auVar29,auVar34,auVar13);
  uVar194 = *(undefined4 *)&(query->p).field_0;
  auVar14._4_4_ = uVar194;
  auVar14._0_4_ = uVar194;
  auVar14._8_4_ = uVar194;
  auVar14._12_4_ = uVar194;
  auVar29 = vfmadd231ps_avx512vl(auVar29,auVar45,auVar14);
  local_d8 = vmovlps_avx(auVar29);
  local_d0 = vextractps_avx(auVar29,2);
  local_c8 = local_68 * query->radius;
  local_88 = context->query_ws;
  local_60 = context->userPtr;
  local_90 = 0;
  local_78._0_8_ = context->func;
  local_78._8_8_ = context->userContext;
  local_58 = 0xffffffffffffffff;
  fVar114 = local_88->radius;
  local_48._4_4_ = fVar114;
  local_48._0_4_ = fVar114;
  local_48._8_4_ = fVar114;
  local_48._12_4_ = fVar114;
  if (bVar5) {
    if (fVar114 < INFINITY) {
      lVar19 = vpextrq_avx(local_78,1);
      if (*(int *)(lVar19 + 0x88) != 0) {
        lVar22 = (ulong)(*(int *)(lVar19 + 0x88) - 1) * 0x40;
        auVar29 = *(undefined1 (*) [16])(lVar19 + lVar22);
        auVar30 = *(undefined1 (*) [16])(lVar19 + 0x10 + lVar22);
        auVar31 = *(undefined1 (*) [16])(lVar19 + 0x20 + lVar22);
        auVar32 = *(undefined1 (*) [16])(lVar19 + 0x30 + lVar22);
        auVar182._4_4_ = fVar114;
        auVar182._0_4_ = fVar114;
        auVar182._8_4_ = fVar114;
        auVar182._12_4_ = fVar114;
        auVar35 = vfnmadd213ps_fma(auVar31,auVar182,auVar32);
        auVar39 = vfnmadd213ps_fma(auVar30,auVar182,auVar35);
        auVar33 = vfnmadd213ps_fma(auVar29,auVar182,auVar39);
        auVar216._8_4_ = 0x7f800000;
        auVar216._0_8_ = 0x7f8000007f800000;
        auVar216._12_4_ = 0x7f800000;
        auVar220._8_4_ = 0xff800000;
        auVar220._0_8_ = 0xff800000ff800000;
        auVar220._12_4_ = 0xff800000;
        auVar45 = vminps_avx(auVar216,auVar33);
        auVar33 = vmaxps_avx(auVar220,auVar33);
        auVar34 = vfmadd213ps_fma(auVar31,local_48,auVar32);
        auVar44 = vfnmadd213ps_fma(auVar30,auVar182,auVar34);
        auVar31 = vfnmadd213ps_fma(auVar29,auVar182,auVar44);
        auVar32 = vminps_avx(auVar45,auVar31);
        auVar31 = vmaxps_avx(auVar33,auVar31);
        auVar33 = vfmadd231ps_fma(auVar35,local_48,auVar30);
        auVar45 = vfnmadd213ps_fma(auVar29,auVar182,auVar33);
        auVar32 = vminps_avx(auVar32,auVar45);
        auVar31 = vmaxps_avx(auVar31,auVar45);
        auVar45 = vfmadd231ps_fma(auVar34,local_48,auVar30);
        auVar30 = vfnmadd213ps_fma(auVar182,auVar29,auVar45);
        auVar32 = vminps_avx(auVar32,auVar30);
        auVar30 = vmaxps_avx(auVar31,auVar30);
        auVar34 = vfmadd231ps_fma(auVar39,local_48,auVar29);
        auVar31 = vminps_avx(auVar32,auVar34);
        auVar30 = vmaxps_avx(auVar30,auVar34);
        auVar32 = vfmadd231ps_fma(auVar44,local_48,auVar29);
        auVar31 = vminps_avx(auVar31,auVar32);
        auVar30 = vmaxps_avx(auVar30,auVar32);
        auVar32 = vfmadd231ps_fma(auVar33,local_48,auVar29);
        auVar31 = vminps_avx(auVar31,auVar32);
        auVar30 = vmaxps_avx(auVar30,auVar32);
        auVar29 = vfmadd231ps_fma(auVar45,local_48,auVar29);
        auVar31 = vminps_avx(auVar31,auVar29);
        auVar29 = vmaxps_avx(auVar30,auVar29);
        auVar29 = vsubps_avx(auVar29,auVar31);
        auVar15._8_4_ = 0x3f000000;
        auVar15._0_8_ = 0x3f0000003f000000;
        auVar15._12_4_ = 0x3f000000;
        local_48 = vmulps_avx512vl(auVar29,auVar15);
      }
    }
  }
  else {
    fVar114 = local_68 * fVar114;
    local_48._4_4_ = fVar114;
    local_48._0_4_ = fVar114;
    local_48._8_4_ = fVar114;
    local_48._12_4_ = fVar114;
  }
  local_98 = p_Var26;
  local_80 = uVar150;
  uVar17 = (**(code **)(p_Var26 + 0x88))(p_Var26 + 0x58,&local_d8);
  pRVar3 = context->userContext;
  uVar24 = pRVar3->instStackSize - 1;
  pRVar3->instStackSize = uVar24;
  pRVar3->instID[uVar24] = 0xffffffff;
  pRVar3->instPrimID[pRVar3->instStackSize] = 0xffffffff;
  return (bool)uVar17;
}

Assistant:

bool InstanceArrayIntersector1MB::pointQuery(PointQuery* query, PointQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      const AffineSpace3fa local2world = instance->getLocal2World(prim.primID_, query->time);
      const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, query->time);
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, prim.primID_, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func, 
          context->userContext,
          similarityScale,
          context->userPtr); 

        bool changed = object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }